

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::aggregateVars(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *lp,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *row,int *i)

{
  Item *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  pointer pnVar8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar9;
  Tolerances *pTVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  Item *pIVar12;
  DataKey *pDVar13;
  int iVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  AggregationPS *this_00;
  undefined8 *puVar24;
  byte bVar25;
  int i_00;
  long lVar26;
  long lVar27;
  int *piVar28;
  int *piVar29;
  bool *pbVar30;
  uint i_01;
  ulong uVar31;
  pointer pnVar32;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar33;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  *psVar34;
  uint *puVar35;
  cpp_dec_float<200U,_int,_void> *pcVar36;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar37;
  soplex *psVar38;
  undefined4 *puVar39;
  uint *puVar40;
  cpp_dec_float<200U,_int,_void> *pcVar41;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar42;
  fpclass_type fVar43;
  long lVar44;
  bool *pbVar45;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  long in_FS_OFFSET;
  byte bVar46;
  double dVar47;
  double a;
  Real RVar48;
  ulong uVar49;
  double local_1db8;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  undefined1 local_1d58 [16];
  undefined1 local_1d48 [16];
  undefined1 local_1d38 [16];
  undefined1 local_1d28 [16];
  undefined1 local_1d18 [16];
  uint local_1d08 [3];
  undefined3 uStack_1cfb;
  int iStack_1cf8;
  bool abStack_1cf4 [4];
  ulong local_1cf0;
  ulong local_1ce8;
  undefined8 uStack_1ce0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_30;
  fpclass_type local_1bc8;
  shared_ptr<soplex::Tolerances> local_1ba0;
  long local_1b90;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_29;
  cpp_dec_float<200U,_int,_void> local_1b08;
  cpp_dec_float<200U,_int,_void> local_1a88;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_42;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aggr_const;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  obj_j;
  undefined1 local_1888 [32];
  undefined1 local_1868 [16];
  undefined1 local_1858 [16];
  undefined1 local_1848 [16];
  undefined1 local_1838 [16];
  undefined1 local_1828 [13];
  undefined3 uStack_181b;
  int iStack_1818;
  bool bStack_1814;
  undefined8 local_1810;
  undefined1 local_1808 [32];
  undefined1 local_17e8 [16];
  undefined1 local_17d8 [16];
  undefined1 local_17c8 [16];
  undefined1 local_17b8 [16];
  undefined1 local_17a8 [13];
  undefined3 uStack_179b;
  int iStack_1798;
  bool bStack_1794;
  undefined8 local_1790;
  undefined1 local_1788 [32];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [13];
  undefined3 uStack_171b;
  int iStack_1718;
  bool bStack_1714;
  undefined8 local_1710;
  undefined1 local_1708 [32];
  undefined1 local_16e8 [16];
  undefined1 local_16d8 [16];
  undefined1 local_16c8 [16];
  undefined1 local_16b8 [16];
  undefined1 local_16a8 [13];
  undefined3 uStack_169b;
  int iStack_1698;
  bool bStack_1694;
  undefined8 local_1690;
  cpp_dec_float<200U,_int,_void> local_1688;
  cpp_dec_float<200U,_int,_void> local_1608;
  cpp_dec_float<200U,_int,_void> local_1588;
  cpp_dec_float<200U,_int,_void> local_1508;
  cpp_dec_float<200U,_int,_void> local_1488;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_46;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_43;
  uint local_12fc [27];
  cpp_dec_float<200U,_int,_void> local_1290;
  cpp_dec_float<200U,_int,_void> local_1210;
  cpp_dec_float<200U,_int,_void> local_1190;
  cpp_dec_float<200U,_int,_void> local_1110;
  cpp_dec_float<200U,_int,_void> local_1090;
  cpp_dec_float<200U,_int,_void> local_1010;
  uint local_f90 [28];
  uint local_f20 [28];
  uint local_eb0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_dc0;
  cpp_dec_float<200U,_int,_void> local_d40;
  cpp_dec_float<200U,_int,_void> local_cc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_bc0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_ac0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_940;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_840;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_740;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_6c0;
  uint local_640 [28];
  uint local_5d0 [28];
  uint local_560 [28];
  uint local_4f0 [28];
  uint local_480 [28];
  uint local_410 [28];
  uint local_3a0 [28];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  cpp_dec_float<200U,_int,_void> local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_35;
  
  bVar46 = 0;
  iVar21 = *i;
  pnVar8 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).right.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar35 = (uint *)(pnVar8 + iVar21);
  pcVar36 = &local_1588;
  for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
    (pcVar36->data)._M_elems[0] = *puVar35;
    puVar35 = puVar35 + 1;
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  local_1588.exp = pnVar8[iVar21].m_backend.exp;
  local_1588.neg = pnVar8[iVar21].m_backend.neg;
  local_1588.fpclass = pnVar8[iVar21].m_backend.fpclass;
  local_1588.prec_elem = pnVar8[iVar21].m_backend.prec_elem;
  pNVar9 = row->m_elem;
  uVar4 = pNVar9->idx;
  lVar26 = (long)(int)uVar4;
  i_01 = pNVar9[1].idx;
  lVar44 = (long)(int)i_01;
  pNVar33 = pNVar9;
  pcVar36 = &local_1a88;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = (pNVar33->val).m_backend.data._M_elems[0];
    pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar33->val).m_backend.data._M_elems + 1);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  local_1a88.exp = (pNVar9->val).m_backend.exp;
  local_1a88.neg = (pNVar9->val).m_backend.neg;
  local_1a88.fpclass = (pNVar9->val).m_backend.fpclass;
  local_1a88.prec_elem = (pNVar9->val).m_backend.prec_elem;
  pNVar33 = pNVar9 + 1;
  pcVar36 = &local_1b08;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = (pNVar33->val).m_backend.data._M_elems[0];
    pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)((pNVar33->val).m_backend.data._M_elems + 1);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  local_1b08.exp = pNVar9[1].val.m_backend.exp;
  local_1b08.neg = pNVar9[1].val.m_backend.neg;
  local_1b08.fpclass = pNVar9[1].val.m_backend.fpclass;
  local_1b08.prec_elem = pNVar9[1].val.m_backend.prec_elem;
  pnVar8 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).low.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar35 = (uint *)(pnVar8 + lVar26);
  pcVar36 = &local_1608;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = *puVar35;
    puVar35 = puVar35 + 1;
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  iVar21 = pnVar8[lVar26].m_backend.exp;
  local_1608.exp = iVar21;
  bVar19 = pnVar8[lVar26].m_backend.neg;
  local_1608.neg = bVar19;
  fVar43 = pnVar8[lVar26].m_backend.fpclass;
  local_1608.prec_elem = pnVar8[lVar26].m_backend.prec_elem;
  local_1ce8 = CONCAT44(local_1ce8._4_4_,local_1608.prec_elem);
  local_1608.fpclass = fVar43;
  pnVar32 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).up.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar35 = (uint *)(pnVar32 + lVar26);
  pcVar36 = &local_1688;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = *puVar35;
    puVar35 = puVar35 + 1;
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  iVar5 = pnVar32[lVar26].m_backend.exp;
  local_1688.exp = iVar5;
  bVar20 = pnVar32[lVar26].m_backend.neg;
  local_1688.neg = bVar20;
  fVar6 = pnVar32[lVar26].m_backend.fpclass;
  iVar7 = pnVar32[lVar26].m_backend.prec_elem;
  local_1688.prec_elem = iVar7;
  local_1688.fpclass = fVar6;
  puVar35 = (uint *)(pnVar8 + lVar44);
  pcVar36 = &local_1488;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = *puVar35;
    puVar35 = puVar35 + 1;
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  local_1488.exp = pnVar8[lVar44].m_backend.exp;
  local_1488.neg = pnVar8[lVar44].m_backend.neg;
  local_1488.fpclass = pnVar8[lVar44].m_backend.fpclass;
  local_1488.prec_elem = pnVar8[lVar44].m_backend.prec_elem;
  puVar35 = (uint *)(pnVar32 + lVar44);
  pcVar36 = &local_1508;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = *puVar35;
    puVar35 = puVar35 + 1;
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
  }
  local_1508.exp = pnVar32[lVar44].m_backend.exp;
  local_1508.neg = pnVar32[lVar44].m_backend.neg;
  local_1508.fpclass = pnVar32[lVar44].m_backend.fpclass;
  local_1508.prec_elem = pnVar32[lVar44].m_backend.prec_elem;
  pcVar36 = &local_1608;
  puVar35 = local_3a0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
    puVar35 = puVar35 + 1;
  }
  pcVar36 = &local_1688;
  puVar35 = local_410;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((pcVar36->data)._M_elems + 1);
    puVar35 = puVar35 + 1;
  }
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1010,this);
  puVar35 = local_3a0;
  psVar38 = (soplex *)local_1708;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)psVar38 = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    psVar38 = psVar38 + (ulong)bVar46 * -8 + 4;
  }
  iStack_1698 = iVar21;
  bStack_1694 = bVar19;
  local_1690._4_4_ = (fpclass_type)local_1ce8;
  local_1690._0_4_ = fVar43;
  puVar35 = local_410;
  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_1788;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_1710._4_4_ = iVar7;
  local_1710._0_4_ = fVar6;
  iStack_1718 = iVar5;
  bStack_1714 = bVar20;
  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_1708,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_1788,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x0);
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  pnVar37 = &result_2;
  psVar34 = &ptr;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)&(psVar34->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
  }
  iStack_1cf8 = result_2.m_backend.exp;
  abStack_1cf4[0] = result_2.m_backend.neg;
  local_1cf0._0_4_ = result_2.m_backend.fpclass;
  local_1cf0._4_4_ = result_2.m_backend.prec_elem;
  if ((result_2.m_backend.neg == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    abStack_1cf4[0] = false;
  }
  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
      (local_1010.fpclass != cpp_dec_float_NaN)) &&
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1010), iVar21 < 1)) {
    return OKAY;
  }
  uVar16 = local_1488._120_8_;
  bVar20 = local_1488.neg;
  iVar5 = local_1488.exp;
  uVar15 = local_1508._120_8_;
  bVar19 = local_1508.neg;
  iVar21 = local_1508.exp;
  pcVar36 = &local_1488;
  puVar35 = local_eb0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  pcVar36 = &local_1508;
  puVar35 = local_f20;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1090,this);
  puVar35 = local_eb0;
  psVar38 = (soplex *)local_1708;
  for (lVar27 = 0x1c; uVar17 = local_1488._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)psVar38 = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    psVar38 = psVar38 + (ulong)bVar46 * -8 + 4;
  }
  iStack_1698 = iVar5;
  bStack_1694 = bVar20;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1c00000000;
  local_1488.fpclass = (fpclass_type)uVar16;
  local_1488.prec_elem = SUB84(uVar16,4);
  local_1690._0_4_ = local_1488.fpclass;
  local_1690._4_4_ = local_1488.prec_elem;
  puVar35 = local_f20;
  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)local_1788;
  local_1488._120_8_ = uVar17;
  for (lVar27 = 0x1c; uVar16 = local_1508._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  iStack_1718 = iVar21;
  bStack_1714 = bVar19;
  local_1508.fpclass = (fpclass_type)uVar15;
  local_1508.prec_elem = SUB84(uVar15,4);
  local_1710._0_4_ = local_1508.fpclass;
  local_1710._4_4_ = local_1508.prec_elem;
  local_1508._120_8_ = uVar16;
  relDiff<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&result_2,(soplex *)local_1708,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)local_1788,
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)0x0);
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  pnVar37 = &result_2;
  psVar34 = &ptr;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)&(psVar34->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
  }
  iStack_1cf8 = result_2.m_backend.exp;
  abStack_1cf4[0] = result_2.m_backend.neg;
  local_1cf0._0_4_ = result_2.m_backend.fpclass;
  local_1cf0._4_4_ = result_2.m_backend.prec_elem;
  if ((result_2.m_backend.neg == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || result_2.m_backend.fpclass != cpp_dec_float_finite)) {
    abStack_1cf4[0] = false;
  }
  if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
      (local_1090.fpclass != cpp_dec_float_NaN)) &&
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1090), iVar21 < 1)) {
    return OKAY;
  }
  local_1690._0_4_ = cpp_dec_float_finite;
  local_1690._4_4_ = 0x1c;
  local_1708._0_16_ = (undefined1  [16])0x0;
  local_1708._16_16_ = (undefined1  [16])0x0;
  local_16e8 = (undefined1  [16])0x0;
  local_16d8 = (undefined1  [16])0x0;
  local_16c8 = (undefined1  [16])0x0;
  local_16b8 = (undefined1  [16])0x0;
  local_16a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_169b = 0;
  iStack_1698 = 0;
  bStack_1694 = false;
  local_1710._0_4_ = cpp_dec_float_finite;
  local_1710._4_4_ = 0x1c;
  local_1788._0_16_ = (undefined1  [16])0x0;
  local_1788._16_16_ = (undefined1  [16])0x0;
  local_1768 = (undefined1  [16])0x0;
  local_1758 = (undefined1  [16])0x0;
  local_1748 = (undefined1  [16])0x0;
  local_1738 = (undefined1  [16])0x0;
  local_1728 = SUB1613((undefined1  [16])0x0,0);
  uStack_171b = 0;
  iStack_1718 = 0;
  bStack_1714 = false;
  local_1790._0_4_ = cpp_dec_float_finite;
  local_1790._4_4_ = 0x1c;
  local_1808._0_16_ = (undefined1  [16])0x0;
  local_1808._16_16_ = (undefined1  [16])0x0;
  local_17e8 = (undefined1  [16])0x0;
  local_17d8 = (undefined1  [16])0x0;
  local_17c8 = (undefined1  [16])0x0;
  local_17b8 = (undefined1  [16])0x0;
  local_17a8 = SUB1613((undefined1  [16])0x0,0);
  uStack_179b = 0;
  iStack_1798 = 0;
  bStack_1794 = false;
  local_1810._0_4_ = cpp_dec_float_finite;
  local_1810._4_4_ = 0x1c;
  local_1888._0_16_ = (undefined1  [16])0x0;
  local_1888._16_16_ = (undefined1  [16])0x0;
  local_1868 = (undefined1  [16])0x0;
  local_1858 = (undefined1  [16])0x0;
  local_1848 = (undefined1  [16])0x0;
  local_1838 = (undefined1  [16])0x0;
  local_1828 = SUB1613((undefined1  [16])0x0,0);
  uStack_181b = 0;
  iStack_1818 = 0;
  bStack_1814 = false;
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 0x1c;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  pcVar36 = &local_1a88;
  pcVar41 = &result_2.m_backend;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  result_2.m_backend.exp = local_1a88.exp;
  result_2.m_backend.neg = local_1a88.neg;
  result_2.m_backend.fpclass = local_1a88.fpclass;
  result_2.m_backend.prec_elem = local_1a88.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_2.m_backend,&local_1b08);
  if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00575adc:
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    pcVar36 = &local_1a88;
    pcVar41 = &result_2.m_backend;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
    }
    result_2.m_backend.exp = local_1a88.exp;
    result_2.m_backend.neg = local_1a88.neg;
    result_2.m_backend.fpclass = local_1a88.fpclass;
    result_2.m_backend.prec_elem = local_1a88.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_2.m_backend,&local_1b08);
    if (result_2.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_005790d8:
      puVar24 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_1d58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar24 = &PTR__SPxException_006a9ee8;
      puVar24[1] = puVar24 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar24 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)ptr.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      *puVar24 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar24,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar21 < 1) goto LAB_005790d8;
    ::soplex::infinity::__tls_init();
    local_1db8 = *(double *)(in_FS_OFFSET + -8);
    dVar47 = -local_1db8;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT416(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    result_2.m_backend.data._M_elems._16_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._32_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._48_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._64_16_ = result_2.m_backend.data._M_elems._0_16_;
    result_2.m_backend.data._M_elems._80_16_ = result_2.m_backend.data._M_elems._0_16_;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar47);
    if (((local_1488.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1488,&result_2.m_backend), 0 < iVar21)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1b08;
      pcVar41 = &obj_j.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1488);
      aggr_const.m_backend.fpclass = cpp_dec_float_finite;
      aggr_const.m_backend.prec_elem = 0x1c;
      aggr_const.m_backend.exp = 0;
      aggr_const.m_backend.neg = false;
      pcVar36 = &local_1588;
      pcVar41 = &aggr_const.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1588.exp;
      aggr_const.m_backend.neg = local_1588.neg;
      aggr_const.m_backend.fpclass = local_1588.fpclass;
      aggr_const.m_backend.prec_elem = local_1588.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1a88);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,dVar47);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1708;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1698 = iStack_1cf8;
    bStack_1694 = abStack_1cf4[0];
    local_1690._0_4_ = (fpclass_type)local_1cf0;
    local_1690._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1db8);
    if (((local_1508.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1508,&result_2.m_backend), iVar21 < 0)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1b08;
      pcVar41 = &obj_j.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1508);
      aggr_const.m_backend.fpclass = cpp_dec_float_finite;
      aggr_const.m_backend.prec_elem = 0x1c;
      aggr_const.m_backend.exp = 0;
      aggr_const.m_backend.neg = false;
      pcVar36 = &local_1588;
      pcVar41 = &aggr_const.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1588.exp;
      aggr_const.m_backend.neg = local_1588.neg;
      aggr_const.m_backend.fpclass = local_1588.fpclass;
      aggr_const.m_backend.prec_elem = local_1588.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1a88);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,local_1db8);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1788;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1718 = iStack_1cf8;
    bStack_1714 = abStack_1cf4[0];
    local_1710._0_4_ = (fpclass_type)local_1cf0;
    local_1710._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar47);
    if (((local_1608.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1608,&result_2.m_backend), 0 < iVar21)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1a88;
      pcVar41 = &obj_j.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1a88.exp;
      obj_j.m_backend.neg = local_1a88.neg;
      obj_j.m_backend.fpclass = local_1a88.fpclass;
      obj_j.m_backend.prec_elem = local_1a88.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1608);
      aggr_const.m_backend.fpclass = cpp_dec_float_finite;
      aggr_const.m_backend.prec_elem = 0x1c;
      aggr_const.m_backend.exp = 0;
      aggr_const.m_backend.neg = false;
      pcVar36 = &local_1588;
      pcVar41 = &aggr_const.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1588.exp;
      aggr_const.m_backend.neg = local_1588.neg;
      aggr_const.m_backend.fpclass = local_1588.fpclass;
      aggr_const.m_backend.prec_elem = local_1588.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,dVar47);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1808;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = abStack_1cf4[0];
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1db8);
    if (((local_1688.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1688,&result_2.m_backend), iVar21 < 0)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1a88;
      pnVar37 = &obj_j;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      pcVar36 = &local_1688;
      goto LAB_00576824;
    }
LAB_005760fa:
    ::soplex::infinity::__tls_init();
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            )ZEXT816(0);
    local_1d58 = ZEXT816(0);
    local_1d48 = ZEXT816(0);
    local_1d38 = ZEXT816(0);
    local_1d28 = ZEXT816(0);
    local_1d18 = ZEXT816(0);
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,local_1db8);
  }
  else {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_2.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (-1 < iVar21) goto LAB_00575adc;
    ::soplex::infinity::__tls_init();
    local_1db8 = *(double *)(in_FS_OFFSET + -8);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1db8);
    if (((local_1508.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1508,&result_2.m_backend), iVar21 < 0)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1b08;
      pcVar41 = &obj_j.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1508);
      aggr_const.m_backend.fpclass = cpp_dec_float_finite;
      aggr_const.m_backend.prec_elem = 0x1c;
      aggr_const.m_backend.exp = 0;
      aggr_const.m_backend.neg = false;
      pcVar36 = &local_1588;
      pcVar41 = &aggr_const.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1588.exp;
      aggr_const.m_backend.neg = local_1588.neg;
      aggr_const.m_backend.fpclass = local_1588.fpclass;
      aggr_const.m_backend.prec_elem = local_1588.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1a88);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,-local_1db8);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1708;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1698 = iStack_1cf8;
    bStack_1694 = abStack_1cf4[0];
    local_1690._0_4_ = (fpclass_type)local_1cf0;
    local_1690._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    dVar47 = -local_1db8;
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar47);
    if (((local_1488.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1488,&result_2.m_backend), 0 < iVar21)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1b08;
      pcVar41 = &obj_j.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1b08.exp;
      obj_j.m_backend.neg = local_1b08.neg;
      obj_j.m_backend.fpclass = local_1b08.fpclass;
      obj_j.m_backend.prec_elem = local_1b08.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1488);
      aggr_const.m_backend.fpclass = cpp_dec_float_finite;
      aggr_const.m_backend.prec_elem = 0x1c;
      aggr_const.m_backend.exp = 0;
      aggr_const.m_backend.neg = false;
      pcVar36 = &local_1588;
      pcVar41 = &aggr_const.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1588.exp;
      aggr_const.m_backend.neg = local_1588.neg;
      aggr_const.m_backend.fpclass = local_1588.fpclass;
      aggr_const.m_backend.prec_elem = local_1588.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1a88);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,local_1db8);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1788;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1718 = iStack_1cf8;
    bStack_1714 = abStack_1cf4[0];
    local_1710._0_4_ = (fpclass_type)local_1cf0;
    local_1710._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,local_1db8);
    if (((local_1688.fpclass == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1688,&result_2.m_backend), iVar21 < 0)) {
      obj_j.m_backend.fpclass = cpp_dec_float_finite;
      obj_j.m_backend.prec_elem = 0x1c;
      obj_j.m_backend.exp = 0;
      obj_j.m_backend.neg = false;
      pcVar36 = &local_1a88;
      pcVar41 = &obj_j.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      obj_j.m_backend.exp = local_1a88.exp;
      obj_j.m_backend.neg = local_1a88.neg;
      obj_j.m_backend.fpclass = local_1a88.fpclass;
      obj_j.m_backend.prec_elem = local_1a88.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&obj_j.m_backend,&local_1688);
      aggr_const.m_backend.fpclass = cpp_dec_float_finite;
      aggr_const.m_backend.prec_elem = 0x1c;
      aggr_const.m_backend.exp = 0;
      aggr_const.m_backend.neg = false;
      pcVar36 = &local_1588;
      pcVar41 = &aggr_const.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
      }
      aggr_const.m_backend.exp = local_1588.exp;
      aggr_const.m_backend.neg = local_1588.neg;
      aggr_const.m_backend.fpclass = local_1588.fpclass;
      aggr_const.m_backend.prec_elem = local_1588.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                (&aggr_const.m_backend,&obj_j.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,dVar47);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1808;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = abStack_1cf4[0];
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar47);
    if (((local_1608.fpclass != cpp_dec_float_NaN) &&
        (result_2.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1608,&result_2.m_backend), iVar21 < 1)) goto LAB_005760fa;
    obj_j.m_backend.fpclass = cpp_dec_float_finite;
    obj_j.m_backend.prec_elem = 0x1c;
    obj_j.m_backend.exp = 0;
    obj_j.m_backend.neg = false;
    pcVar36 = &local_1a88;
    pnVar37 = &obj_j;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    pcVar36 = &local_1608;
LAB_00576824:
    obj_j.m_backend.exp = local_1a88.exp;
    obj_j.m_backend.neg = local_1a88.neg;
    obj_j.m_backend._120_8_ = local_1a88._120_8_;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&obj_j.m_backend,pcVar36);
    aggr_const.m_backend.fpclass = cpp_dec_float_finite;
    aggr_const.m_backend.prec_elem = 0x1c;
    aggr_const.m_backend.exp = 0;
    aggr_const.m_backend.neg = false;
    pcVar36 = &local_1588;
    pcVar41 = &aggr_const.m_backend;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
    }
    aggr_const.m_backend.exp = local_1588.exp;
    aggr_const.m_backend.neg = local_1588.neg;
    aggr_const.m_backend.fpclass = local_1588.fpclass;
    aggr_const.m_backend.prec_elem = local_1588.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&aggr_const.m_backend,&obj_j.m_backend);
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
            )ZEXT816(0);
    local_1d58 = ZEXT816(0);
    local_1d48 = ZEXT816(0);
    local_1d38 = ZEXT816(0);
    local_1d28 = ZEXT816(0);
    local_1d18 = ZEXT816(0);
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              ((cpp_dec_float<200U,_int,_void> *)&ptr,&aggr_const.m_backend,&local_1b08);
  }
  psVar34 = &ptr;
  puVar39 = (undefined4 *)local_1888;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar39 = *(undefined4 *)
                &(psVar34->
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
    puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
  }
  iStack_1818 = iStack_1cf8;
  bStack_1814 = abStack_1cf4[0];
  local_1810._0_4_ = (fpclass_type)local_1cf0;
  local_1810._4_4_ = local_1cf0._4_4_;
  ::soplex::infinity::__tls_init();
  dVar47 = *(double *)(in_FS_OFFSET + -8);
  a = -dVar47;
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&ptr,a);
  if ((((fpclass_type)local_1690 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_1cf0 == cpp_dec_float_NaN)) ||
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)local_1708,
                          (cpp_dec_float<200U,_int,_void> *)&ptr), 0 < iVar21)) {
LAB_00576980:
    ::soplex::infinity::__tls_init();
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,a);
    if ((((fpclass_type)local_1790 == cpp_dec_float_NaN) ||
        ((fpclass_type)local_1cf0 == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_1808,
                            (cpp_dec_float<200U,_int,_void> *)&ptr), 0 < iVar21)) {
LAB_005769ff:
      puVar35 = (uint *)local_1708;
      pnVar37 = &local_6c0;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar37->m_backend).data._M_elems[0] = *puVar35;
        puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      local_6c0.m_backend.exp = iStack_1698;
      local_6c0.m_backend.neg = bStack_1694;
      local_6c0.m_backend.fpclass = (fpclass_type)local_1690;
      local_6c0.m_backend.prec_elem = local_1690._4_4_;
      pcVar36 = &local_1608;
      pnVar37 = &local_740;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      local_740.m_backend.exp = local_1608.exp;
      local_740.m_backend.neg = local_1608.neg;
      local_740.m_backend.fpclass = local_1608.fpclass;
      local_740.m_backend.prec_elem = local_1608.prec_elem;
      pTVar10 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      p_Var11 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        }
      }
      RVar48 = Tolerances::epsilon(pTVar10);
      bVar19 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                         (&local_6c0,&local_740,RVar48);
      if (bVar19) {
        puVar35 = (uint *)local_1788;
        pnVar37 = &local_7c0;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_7c0.m_backend.exp = iStack_1718;
        local_7c0.m_backend.neg = bStack_1714;
        local_7c0.m_backend.fpclass = (fpclass_type)local_1710;
        local_7c0.m_backend.prec_elem = local_1710._4_4_;
        pcVar36 = &local_1688;
        pnVar37 = &local_840;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_840.m_backend.exp = local_1688.exp;
        local_840.m_backend.neg = local_1688.neg;
        local_840.m_backend.fpclass = local_1688.fpclass;
        local_840.m_backend.prec_elem = local_1688.prec_elem;
        pTVar10 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_01 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
        RVar48 = Tolerances::epsilon(pTVar10);
        bVar20 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_7c0,&local_840,RVar48);
      }
      else {
        bVar20 = false;
      }
      if (bVar19 && this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
      }
      if (bVar20 == false) {
        puVar35 = (uint *)local_1808;
        pnVar37 = &local_ac0;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_ac0.m_backend.exp = iStack_1798;
        local_ac0.m_backend.neg = bStack_1794;
        local_ac0.m_backend.fpclass = (fpclass_type)local_1790;
        local_ac0.m_backend.prec_elem = local_1790._4_4_;
        pcVar36 = &local_1488;
        pnVar37 = &local_b40;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_b40.m_backend.exp = local_1488.exp;
        local_b40.m_backend.neg = local_1488.neg;
        local_b40.m_backend.fpclass = local_1488.fpclass;
        local_b40.m_backend.prec_elem = local_1488.prec_elem;
        pTVar10 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var11 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
        }
        RVar48 = Tolerances::epsilon(pTVar10);
        bVar19 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_ac0,&local_b40,RVar48);
        if (bVar19) {
          puVar35 = (uint *)local_1888;
          pnVar37 = &local_bc0;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar37->m_backend).data._M_elems[0] = *puVar35;
            puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
          }
          local_bc0.m_backend.exp = iStack_1818;
          local_bc0.m_backend.neg = bStack_1814;
          local_bc0.m_backend.fpclass = (fpclass_type)local_1810;
          local_bc0.m_backend.prec_elem = local_1810._4_4_;
          pcVar36 = &local_1508;
          pnVar37 = &local_c40;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
          }
          local_c40.m_backend.exp = local_1508.exp;
          local_c40.m_backend.neg = local_1508.neg;
          local_c40.m_backend.fpclass = local_1508.fpclass;
          local_c40.m_backend.prec_elem = local_1508.prec_elem;
          pTVar10 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          this_01 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          RVar48 = Tolerances::epsilon(pTVar10);
          bVar20 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_bc0,&local_c40,RVar48);
        }
        else {
          bVar20 = false;
        }
        if (bVar19 && this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        if (bVar20 != false) goto LAB_0057719a;
        pcVar36 = &local_1a88;
        psVar34 = &ptr;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          *(uint *)&(psVar34->
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
        }
        iStack_1cf8 = local_1a88.exp;
        abStack_1cf4[0] = local_1a88.neg;
        local_1cf0._0_4_ = local_1a88.fpclass;
        local_1cf0._4_4_ = local_1a88.prec_elem;
        fVar43 = local_1a88.fpclass;
        if ((local_1a88.neg == true) &&
           ((int)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != 0 || fVar43 != cpp_dec_float_finite)) {
          abStack_1cf4[0] = false;
        }
        pcVar36 = &local_1b08;
        pnVar37 = &result_2;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = local_1b08.exp;
        result_2.m_backend.neg = local_1b08.neg;
        result_2.m_backend.fpclass = local_1b08.fpclass;
        result_2.m_backend.prec_elem = local_1b08.prec_elem;
        if ((local_1b08.neg == true) &&
           (result_2.m_backend.data._M_elems[0] != 0 || local_1b08.fpclass != cpp_dec_float_finite))
        {
          result_2.m_backend.neg = false;
        }
        bVar19 = true;
        if (local_1b08.fpclass != cpp_dec_float_NaN && fVar43 != cpp_dec_float_NaN)
        goto LAB_0057717b;
      }
      else {
        puVar35 = (uint *)local_1808;
        pnVar37 = &local_8c0;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_8c0.m_backend.exp = iStack_1798;
        local_8c0.m_backend.neg = bStack_1794;
        local_8c0.m_backend.fpclass = (fpclass_type)local_1790;
        local_8c0.m_backend.prec_elem = local_1790._4_4_;
        pcVar36 = &local_1488;
        pnVar37 = &local_940;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        local_940.m_backend.exp = local_1488.exp;
        local_940.m_backend.neg = local_1488.neg;
        local_940.m_backend.fpclass = local_1488.fpclass;
        local_940.m_backend.prec_elem = local_1488.prec_elem;
        pTVar10 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        p_Var11 = (this->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
          }
        }
        RVar48 = Tolerances::epsilon(pTVar10);
        bVar19 = LE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                           (&local_8c0,&local_940,RVar48);
        if (bVar19) {
          puVar35 = (uint *)local_1888;
          pnVar37 = &local_9c0;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar37->m_backend).data._M_elems[0] = *puVar35;
            puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
          }
          local_9c0.m_backend.exp = iStack_1818;
          local_9c0.m_backend.neg = bStack_1814;
          local_9c0.m_backend.fpclass = (fpclass_type)local_1810;
          local_9c0.m_backend.prec_elem = local_1810._4_4_;
          pcVar36 = &local_1508;
          pnVar37 = &local_a40;
          for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
            (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)
                      ((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
          }
          local_a40.m_backend.exp = local_1508.exp;
          local_a40.m_backend.neg = local_1508.neg;
          local_a40.m_backend.fpclass = local_1508.fpclass;
          local_a40.m_backend.prec_elem = local_1508.prec_elem;
          pTVar10 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          this_01 = (this->
                    super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          RVar48 = Tolerances::epsilon(pTVar10);
          bVar20 = GE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                             (&local_9c0,&local_a40,RVar48);
        }
        else {
          bVar20 = false;
        }
        if (bVar19 && this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
        }
        if (bVar20 == false) goto LAB_00577301;
        pcVar36 = &local_1a88;
        psVar34 = &ptr;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          *(uint *)&(psVar34->
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                     *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
        }
        iStack_1cf8 = local_1a88.exp;
        abStack_1cf4[0] = local_1a88.neg;
        local_1cf0._0_4_ = local_1a88.fpclass;
        local_1cf0._4_4_ = local_1a88.prec_elem;
        fVar43 = local_1a88.fpclass;
        if ((local_1a88.neg == true) &&
           ((int)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != 0 || fVar43 != cpp_dec_float_finite)) {
          abStack_1cf4[0] = false;
        }
        pcVar36 = &local_1b08;
        pnVar37 = &result_2;
        for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
          pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4)
          ;
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = local_1b08.exp;
        result_2.m_backend.neg = local_1b08.neg;
        result_2.m_backend.fpclass = local_1b08.fpclass;
        result_2.m_backend.prec_elem = local_1b08.prec_elem;
        if ((local_1b08.neg == true) &&
           (result_2.m_backend.data._M_elems[0] != 0 || local_1b08.fpclass != cpp_dec_float_finite))
        {
          result_2.m_backend.neg = false;
        }
        bVar19 = true;
        if (local_1b08.fpclass != cpp_dec_float_NaN && fVar43 != cpp_dec_float_NaN) {
LAB_0057717b:
          result_2.m_backend.exp = local_1b08.exp;
          result_2.m_backend._120_8_ = local_1b08._120_8_;
          iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_2.m_backend);
          bVar19 = iVar21 < 1;
        }
      }
      if (bVar19) goto LAB_0057719a;
    }
    else {
      ::soplex::infinity::__tls_init();
      result_2.m_backend.fpclass = cpp_dec_float_finite;
      result_2.m_backend.prec_elem = 0x1c;
      result_2.m_backend.data._M_elems[0] = 0;
      result_2.m_backend.data._M_elems[1] = 0;
      result_2.m_backend.data._M_elems[2] = 0;
      result_2.m_backend.data._M_elems[3] = 0;
      result_2.m_backend.data._M_elems[4] = 0;
      result_2.m_backend.data._M_elems[5] = 0;
      result_2.m_backend.data._M_elems[6] = 0;
      result_2.m_backend.data._M_elems[7] = 0;
      result_2.m_backend.data._M_elems[8] = 0;
      result_2.m_backend.data._M_elems[9] = 0;
      result_2.m_backend.data._M_elems[10] = 0;
      result_2.m_backend.data._M_elems[0xb] = 0;
      result_2.m_backend.data._M_elems[0xc] = 0;
      result_2.m_backend.data._M_elems[0xd] = 0;
      result_2.m_backend.data._M_elems[0xe] = 0;
      result_2.m_backend.data._M_elems[0xf] = 0;
      result_2.m_backend.data._M_elems[0x10] = 0;
      result_2.m_backend.data._M_elems[0x11] = 0;
      result_2.m_backend.data._M_elems[0x12] = 0;
      result_2.m_backend.data._M_elems[0x13] = 0;
      result_2.m_backend.data._M_elems[0x14] = 0;
      result_2.m_backend.data._M_elems[0x15] = 0;
      result_2.m_backend.data._M_elems[0x16] = 0;
      result_2.m_backend.data._M_elems[0x17] = 0;
      result_2.m_backend.data._M_elems[0x18] = 0;
      result_2.m_backend.data._M_elems[0x19] = 0;
      result_2.m_backend.data._M_elems._104_5_ = 0;
      result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result_2.m_backend.exp = 0;
      result_2.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_2,dVar47);
      if ((((fpclass_type)local_1810 == cpp_dec_float_NaN) ||
          (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                             ((cpp_dec_float<200U,_int,_void> *)local_1888,&result_2.m_backend),
         iVar21 < 0)) goto LAB_005769ff;
    }
  }
  else {
    ::soplex::infinity::__tls_init();
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems[6] = 0;
    result_2.m_backend.data._M_elems[7] = 0;
    result_2.m_backend.data._M_elems[8] = 0;
    result_2.m_backend.data._M_elems[9] = 0;
    result_2.m_backend.data._M_elems[10] = 0;
    result_2.m_backend.data._M_elems[0xb] = 0;
    result_2.m_backend.data._M_elems[0xc] = 0;
    result_2.m_backend.data._M_elems[0xd] = 0;
    result_2.m_backend.data._M_elems[0xe] = 0;
    result_2.m_backend.data._M_elems[0xf] = 0;
    result_2.m_backend.data._M_elems[0x10] = 0;
    result_2.m_backend.data._M_elems[0x11] = 0;
    result_2.m_backend.data._M_elems[0x12] = 0;
    result_2.m_backend.data._M_elems[0x13] = 0;
    result_2.m_backend.data._M_elems[0x14] = 0;
    result_2.m_backend.data._M_elems[0x15] = 0;
    result_2.m_backend.data._M_elems[0x16] = 0;
    result_2.m_backend.data._M_elems[0x17] = 0;
    result_2.m_backend.data._M_elems[0x18] = 0;
    result_2.m_backend.data._M_elems[0x19] = 0;
    result_2.m_backend.data._M_elems._104_5_ = 0;
    result_2.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,dVar47);
    if ((((fpclass_type)local_1710 == cpp_dec_float_NaN) ||
        (result_2.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)local_1788,&result_2.m_backend),
       iVar21 < 0)) goto LAB_00576980;
LAB_0057719a:
    pcVar36 = &local_1a88;
    psVar34 = &ptr;
    for (lVar26 = 0x1c; bVar19 = local_1a88.neg, iVar21 = local_1a88.exp, lVar26 != 0;
        lVar26 = lVar26 + -1) {
      *(uint *)&(psVar34->
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
    }
    pcVar36 = &local_1608;
    pnVar37 = &result_2;
    for (lVar26 = 0x1c; bVar20 = local_1608.neg, iVar5 = local_1608.exp, lVar26 != 0;
        lVar26 = lVar26 + -1) {
      (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    pcVar36 = &local_1688;
    pnVar37 = &aggr_const;
    for (lVar26 = 0x1c; bVar18 = local_1688.neg, iVar14 = local_1688.exp, lVar26 != 0;
        lVar26 = lVar26 + -1) {
      (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    pcVar36 = &local_1b08;
    pcVar41 = &local_1a88;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1a88.exp = local_1b08.exp;
    local_1a88.neg = local_1b08.neg;
    psVar34 = &ptr;
    pcVar36 = &local_1b08;
    for (lVar26 = 0x1c; uVar15 = local_1a88._120_8_, lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar36->data)._M_elems[0] =
           *(uint *)&(psVar34->
                     super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1b08.exp = iVar21;
    local_1b08.neg = bVar19;
    local_1a88.fpclass = local_1b08.fpclass;
    local_1a88.prec_elem = local_1b08.prec_elem;
    uVar16 = local_1a88._120_8_;
    local_1a88.fpclass = (fpclass_type)uVar15;
    local_1a88.prec_elem = SUB84(uVar15,4);
    local_1b08.fpclass = local_1a88.fpclass;
    local_1b08.prec_elem = local_1a88.prec_elem;
    pcVar36 = &local_1488;
    pcVar41 = &local_1608;
    for (lVar26 = 0x1c; uVar15 = local_1608._120_8_, lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1608.exp = local_1488.exp;
    local_1608.neg = local_1488.neg;
    pnVar37 = &result_2;
    pcVar36 = &local_1488;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1488.exp = iVar5;
    local_1488.neg = bVar20;
    local_1608.fpclass = local_1488.fpclass;
    local_1608.prec_elem = local_1488.prec_elem;
    uVar17 = local_1608._120_8_;
    local_1608.fpclass = (fpclass_type)uVar15;
    local_1608.prec_elem = SUB84(uVar15,4);
    local_1488.fpclass = local_1608.fpclass;
    local_1488.prec_elem = local_1608.prec_elem;
    pcVar36 = &local_1508;
    pcVar41 = &local_1688;
    local_1608._120_8_ = uVar17;
    for (lVar26 = 0x1c; uVar15 = local_1688._120_8_, lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1688.exp = local_1508.exp;
    local_1688.neg = local_1508.neg;
    pnVar37 = &aggr_const;
    pcVar36 = &local_1508;
    for (lVar26 = 0x1c; lVar26 != 0; lVar26 = lVar26 + -1) {
      (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    }
    local_1508.exp = iVar14;
    local_1508.neg = bVar18;
    local_1688.fpclass = local_1508.fpclass;
    local_1688.prec_elem = local_1508.prec_elem;
    uVar17 = local_1688._120_8_;
    local_1688.fpclass = (fpclass_type)uVar15;
    local_1688.prec_elem = SUB84(uVar15,4);
    local_1508.fpclass = local_1688.fpclass;
    local_1508.prec_elem = local_1688.prec_elem;
    lVar26 = lVar44;
    i_01 = uVar4;
    local_1a88._120_8_ = uVar16;
    local_1688._120_8_ = uVar17;
  }
LAB_00577301:
  pIVar12 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem;
  pDVar13 = (lp->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey;
  i_00 = (int)lVar26;
  local_1b90 = (long)i_00;
  iVar21 = pDVar13[local_1b90].idx;
  iVar5 = pDVar13[(int)i_01].idx;
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1b08,&local_1a88);
  uVar49 = local_1cf0;
  iVar14 = iStack_1cf8;
  puVar35 = (uint *)((long)&ptr.
                            super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + 4);
  puVar40 = local_12fc;
  for (lVar27 = 0x1b; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar40 = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    puVar40 = puVar40 + (ulong)bVar46 * -2 + 1;
  }
  local_1ce8 = CONCAT44(local_1ce8._4_4_,
                        (int)ptr.
                             super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
  bVar25 = ((int)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != 0 || (fpclass_type)local_1cf0 != cpp_dec_float_finite) ^ abStack_1cf4[0]
  ;
  aggr_const.m_backend.fpclass = cpp_dec_float_finite;
  aggr_const.m_backend.prec_elem = 0x1c;
  aggr_const.m_backend.data._M_elems[0] = 0;
  aggr_const.m_backend.data._M_elems[1] = 0;
  aggr_const.m_backend.data._M_elems[2] = 0;
  aggr_const.m_backend.data._M_elems[3] = 0;
  aggr_const.m_backend.data._M_elems[4] = 0;
  aggr_const.m_backend.data._M_elems[5] = 0;
  aggr_const.m_backend.data._M_elems[6] = 0;
  aggr_const.m_backend.data._M_elems[7] = 0;
  aggr_const.m_backend.data._M_elems[8] = 0;
  aggr_const.m_backend.data._M_elems[9] = 0;
  aggr_const.m_backend.data._M_elems[10] = 0;
  aggr_const.m_backend.data._M_elems[0xb] = 0;
  aggr_const.m_backend.data._M_elems[0xc] = 0;
  aggr_const.m_backend.data._M_elems[0xd] = 0;
  aggr_const.m_backend.data._M_elems[0xe] = 0;
  aggr_const.m_backend.data._M_elems[0xf] = 0;
  aggr_const.m_backend.data._M_elems[0x10] = 0;
  aggr_const.m_backend.data._M_elems[0x11] = 0;
  aggr_const.m_backend.data._M_elems[0x12] = 0;
  aggr_const.m_backend.data._M_elems[0x13] = 0;
  aggr_const.m_backend.data._M_elems[0x14] = 0;
  aggr_const.m_backend.data._M_elems[0x15] = 0;
  aggr_const.m_backend.data._M_elems[0x16] = 0;
  aggr_const.m_backend.data._M_elems[0x17] = 0;
  aggr_const.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  aggr_const.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  aggr_const.m_backend.exp = 0;
  aggr_const.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&aggr_const.m_backend,&local_1588,&local_1a88);
  if (0 < pIVar12[iVar21].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    pIVar1 = pIVar12 + iVar21;
    pIVar12 = pIVar12 + iVar5;
    lVar27 = 0;
    do {
      uVar4 = (pIVar1->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem[lVar27].idx;
      pNVar9 = (pIVar1->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pNVar33 = pNVar9 + lVar27;
      psVar34 = &ptr;
      for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
        *(undefined4 *)
         &(psVar34->
          super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr = (pNVar33->val).m_backend.data._M_elems[0];
        pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar33 + ((ulong)bVar46 * -2 + 1) * 4);
        psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                   *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      }
      iStack_1cf8 = pNVar9[lVar27].val.m_backend.exp;
      abStack_1cf4[0] = pNVar9[lVar27].val.m_backend.neg;
      local_1cf0._0_4_ = pNVar9[lVar27].val.m_backend.fpclass;
      local_1cf0._4_4_ = pNVar9[lVar27].val.m_backend.prec_elem;
      if (uVar4 != *i) {
        pnVar8 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar32 = pnVar8 + (int)uVar4;
        pnVar37 = &result_2;
        for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pnVar32->m_backend).data._M_elems[0];
          pnVar32 = (pointer)((long)pnVar32 + ((ulong)bVar46 * -2 + 1) * 4);
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        result_2.m_backend.exp = pnVar8[(int)uVar4].m_backend.exp;
        result_2.m_backend.neg = pnVar8[(int)uVar4].m_backend.neg;
        result_2.m_backend.fpclass = pnVar8[(int)uVar4].m_backend.fpclass;
        result_2.m_backend.prec_elem = pnVar8[(int)uVar4].m_backend.prec_elem;
        pnVar8 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pnVar32 = pnVar8 + (int)uVar4;
        pnVar37 = &obj_j;
        for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
          (pnVar37->m_backend).data._M_elems[0] = (pnVar32->m_backend).data._M_elems[0];
          pnVar32 = (pointer)((long)pnVar32 + ((ulong)bVar46 * -2 + 1) * 4);
          pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        }
        obj_j.m_backend.exp = pnVar8[(int)uVar4].m_backend.exp;
        obj_j.m_backend.neg = pnVar8[(int)uVar4].m_backend.neg;
        obj_j.m_backend.fpclass = pnVar8[(int)uVar4].m_backend.fpclass;
        obj_j.m_backend.prec_elem = pnVar8[(int)uVar4].m_backend.prec_elem;
        ::soplex::infinity::__tls_init();
        result_30.m_backend.fpclass = cpp_dec_float_finite;
        result_30.m_backend.prec_elem = 0x1c;
        result_30.m_backend.data._M_elems[0] = 0;
        result_30.m_backend.data._M_elems[1] = 0;
        result_30.m_backend.data._M_elems[2] = 0;
        result_30.m_backend.data._M_elems[3] = 0;
        result_30.m_backend.data._M_elems[4] = 0;
        result_30.m_backend.data._M_elems[5] = 0;
        result_30.m_backend.data._M_elems[6] = 0;
        result_30.m_backend.data._M_elems[7] = 0;
        result_30.m_backend.data._M_elems[8] = 0;
        result_30.m_backend.data._M_elems[9] = 0;
        result_30.m_backend.data._M_elems[10] = 0;
        result_30.m_backend.data._M_elems[0xb] = 0;
        result_30.m_backend.data._M_elems[0xc] = 0;
        result_30.m_backend.data._M_elems[0xd] = 0;
        result_30.m_backend.data._M_elems[0xe] = 0;
        result_30.m_backend.data._M_elems[0xf] = 0;
        result_30.m_backend.data._M_elems[0x10] = 0;
        result_30.m_backend.data._M_elems[0x11] = 0;
        result_30.m_backend.data._M_elems[0x12] = 0;
        result_30.m_backend.data._M_elems[0x13] = 0;
        result_30.m_backend.data._M_elems[0x14] = 0;
        result_30.m_backend.data._M_elems[0x15] = 0;
        result_30.m_backend.data._M_elems[0x16] = 0;
        result_30.m_backend.data._M_elems[0x17] = 0;
        result_30.m_backend.data._M_elems[0x18] = 0;
        result_30.m_backend.data._M_elems[0x19] = 0;
        result_30.m_backend.data._M_elems._104_5_ = 0;
        result_30.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_30.m_backend.exp = 0;
        result_30.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_30.m_backend,a);
        if (((result_2.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result_30.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&result_2.m_backend,&result_30.m_backend), 0 < iVar21)) {
          result_29.m_backend.fpclass = cpp_dec_float_finite;
          result_29.m_backend.prec_elem = 0x1c;
          result_29.m_backend.neg = false;
          result_29.m_backend.exp = 0;
          pnVar37 = &aggr_const;
          pcVar36 = &result_29.m_backend;
          for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
            (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
          }
          result_29.m_backend.exp = aggr_const.m_backend.exp;
          result_29.m_backend.neg = aggr_const.m_backend.neg;
          result_29.m_backend.fpclass = aggr_const.m_backend.fpclass;
          result_29.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_29.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
          result_30.m_backend.fpclass = cpp_dec_float_finite;
          result_30.m_backend.prec_elem = 0x1c;
          result_30.m_backend.exp = 0;
          result_30.m_backend.neg = false;
          pnVar37 = &result_2;
          pnVar42 = &result_30;
          for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
            (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
            pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
          }
          result_30.m_backend.exp = result_2.m_backend.exp;
          result_30.m_backend.neg = result_2.m_backend.neg;
          result_30.m_backend.fpclass = result_2.m_backend.fpclass;
          result_30.m_backend.prec_elem = result_2.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_30.m_backend,&result_29.m_backend);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x33])(lp,(ulong)uVar4,&result_30,0);
          piVar28 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar28 = *piVar28 + 1;
        }
        ::soplex::infinity::__tls_init();
        result_30.m_backend.fpclass = cpp_dec_float_finite;
        result_30.m_backend.prec_elem = 0x1c;
        result_30.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_30.m_backend.data._M_elems._16_16_ = ZEXT816(0);
        result_30.m_backend.data._M_elems._32_16_ = ZEXT816(0);
        result_30.m_backend.data._M_elems._48_16_ = ZEXT816(0);
        result_30.m_backend.data._M_elems._64_16_ = ZEXT816(0);
        result_30.m_backend.data._M_elems._80_16_ = ZEXT816(0);
        result_30.m_backend.data._M_elems[0x18] = 0;
        result_30.m_backend.data._M_elems[0x19] = 0;
        result_30.m_backend.data._M_elems._104_5_ = 0;
        result_30.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_30.m_backend.exp = 0;
        result_30.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&result_30.m_backend,dVar47);
        if (((obj_j.m_backend.fpclass != cpp_dec_float_NaN) &&
            (result_30.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                               (&obj_j.m_backend,&result_30.m_backend), iVar21 < 0)) {
          result_29.m_backend.fpclass = cpp_dec_float_finite;
          result_29.m_backend.prec_elem = 0x1c;
          result_29.m_backend.neg = false;
          result_29.m_backend.exp = 0;
          pnVar37 = &aggr_const;
          pcVar36 = &result_29.m_backend;
          for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
            (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
          }
          result_29.m_backend.exp = aggr_const.m_backend.exp;
          result_29.m_backend.neg = aggr_const.m_backend.neg;
          result_29.m_backend.fpclass = aggr_const.m_backend.fpclass;
          result_29.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                    (&result_29.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
          result_30.m_backend.fpclass = cpp_dec_float_finite;
          result_30.m_backend.prec_elem = 0x1c;
          result_30.m_backend.exp = 0;
          result_30.m_backend.neg = false;
          pnVar37 = &obj_j;
          pnVar42 = &result_30;
          for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
            (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
            pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
            pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
          }
          result_30.m_backend.exp = obj_j.m_backend.exp;
          result_30.m_backend.neg = obj_j.m_backend.neg;
          result_30.m_backend.fpclass = obj_j.m_backend.fpclass;
          result_30.m_backend.prec_elem = obj_j.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                    (&result_30.m_backend,&result_29.m_backend);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x36])(lp,(ulong)uVar4,&result_30,0);
          piVar28 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_chgLRhs;
          *piVar28 = *piVar28 + 1;
        }
        uVar31 = local_1cf0;
        result_30.m_backend.fpclass = cpp_dec_float_finite;
        result_30.m_backend.prec_elem = 0x1c;
        result_30.m_backend.data._M_elems[4] = 0;
        result_30.m_backend.data._M_elems[5] = 0;
        result_30.m_backend.data._M_elems[6] = 0;
        result_30.m_backend.data._M_elems[7] = 0;
        result_30.m_backend.data._M_elems[8] = 0;
        result_30.m_backend.data._M_elems[9] = 0;
        result_30.m_backend.data._M_elems[10] = 0;
        result_30.m_backend.data._M_elems[0xb] = 0;
        result_30.m_backend.data._M_elems[0xc] = 0;
        result_30.m_backend.data._M_elems[0xd] = 0;
        result_30.m_backend.data._M_elems[0xe] = 0;
        result_30.m_backend.data._M_elems[0xf] = 0;
        result_30.m_backend.data._M_elems[0x10] = 0;
        result_30.m_backend.data._M_elems[0x11] = 0;
        result_30.m_backend.data._M_elems[0x12] = 0;
        result_30.m_backend.data._M_elems[0x13] = 0;
        result_30.m_backend.data._M_elems[0x14] = 0;
        result_30.m_backend.data._M_elems[0x15] = 0;
        result_30.m_backend.data._M_elems[0x16] = 0;
        result_30.m_backend.data._M_elems[0x17] = 0;
        result_30.m_backend.data._M_elems[0x18] = 0;
        result_30.m_backend.data._M_elems[0x19] = 0;
        result_30.m_backend.data._M_elems._104_5_ = 0;
        result_30.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        result_30.m_backend.exp = 0;
        result_30.m_backend.neg = false;
        result_30.m_backend.data._M_elems._4_12_ = SUB1612((undefined1  [16])0x0,4);
        result_30.m_backend.data._M_elems[0] = (fpclass_type)local_1ce8;
        puVar35 = local_12fc;
        puVar40 = result_30.m_backend.data._M_elems + 1;
        for (lVar44 = 0x1b; lVar44 != 0; lVar44 = lVar44 + -1) {
          *puVar40 = *puVar35;
          puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
          puVar40 = puVar40 + (ulong)bVar46 * -2 + 1;
        }
        result_30.m_backend.exp = iVar14;
        local_1cf0._0_4_ = (fpclass_type)uVar49;
        local_1cf0._4_4_ = SUB84(uVar49,4);
        result_30.m_backend.fpclass = (fpclass_type)local_1cf0;
        result_30.m_backend.prec_elem = local_1cf0._4_4_;
        local_1cf0 = uVar31;
        result_30.m_backend.neg = (bool)bVar25;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                  (&result_30.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
        pNVar9 = (pIVar12->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar9 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) ||
           (uVar31 = (ulong)(pIVar12->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused, (long)uVar31 < 1)) {
LAB_005779d9:
          uVar22 = 0xffffffff;
        }
        else {
          if (pNVar9->idx == uVar4) {
            bVar19 = true;
            uVar23 = 0;
          }
          else {
            uVar23 = 0;
            piVar28 = &pNVar9[1].idx;
            do {
              if (uVar31 - 1 == uVar23) goto LAB_005779d9;
              uVar23 = uVar23 + 1;
              uVar22 = *piVar28;
              piVar28 = piVar28 + 0x21;
            } while (uVar22 != uVar4);
            bVar19 = uVar23 < uVar31;
          }
          uVar22 = (uint)uVar23;
          if (!bVar19) goto LAB_005779d9;
        }
        if (-1 < (int)uVar22) {
          pNVar9 = (pIVar12->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          pNVar33 = pNVar9 + uVar22;
          pcVar36 = &result_29.m_backend;
          for (lVar44 = 0x1c; lVar44 != 0; lVar44 = lVar44 + -1) {
            (pcVar36->data)._M_elems[0] = (pNVar33->val).m_backend.data._M_elems[0];
            pNVar33 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)((long)pNVar33 + ((ulong)bVar46 * -2 + 1) * 4);
            pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
          }
          result_29.m_backend.exp = pNVar9[uVar22].val.m_backend.exp;
          result_29.m_backend.neg = pNVar9[uVar22].val.m_backend.neg;
          result_29.m_backend.fpclass = pNVar9[uVar22].val.m_backend.fpclass;
          result_29.m_backend.prec_elem = pNVar9[uVar22].val.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                    (&result_30.m_backend,&result_29.m_backend);
          piVar28 = &(this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).m_remNzos;
          *piVar28 = *piVar28 + 1;
        }
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x43])(lp,(ulong)uVar4,(ulong)i_01,&result_30.m_backend,0);
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < (pIVar1->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::obj(&obj_j,lp,i_00);
  uVar15 = obj_j.m_backend._120_8_;
  bVar19 = obj_j.m_backend.neg;
  iVar21 = obj_j.m_backend.exp;
  pnVar37 = &obj_j;
  puVar35 = local_480;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1110,this);
  puVar35 = local_480;
  psVar34 = &ptr;
  for (lVar27 = 0x1c; uVar16 = obj_j.m_backend._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)&(psVar34->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
  }
  iStack_1cf8 = iVar21;
  abStack_1cf4[0] = bVar19;
  obj_j.m_backend.fpclass = (fpclass_type)uVar15;
  obj_j.m_backend.prec_elem = SUB84(uVar15,4);
  local_1cf0._0_4_ = obj_j.m_backend.fpclass;
  local_1cf0._4_4_ = obj_j.m_backend.prec_elem;
  local_1bc8 = (fpclass_type)uVar15;
  if ((bVar19 == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || local_1bc8 != cpp_dec_float_finite)) {
    abStack_1cf4[0] = false;
  }
  obj_j.m_backend._120_8_ = uVar16;
  if (((local_1bc8 != cpp_dec_float_NaN) && (local_1110.fpclass != cpp_dec_float_NaN)) &&
     (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                         ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1110), 0 < iVar21)) {
    result_35.m_backend.fpclass = cpp_dec_float_finite;
    result_35.m_backend.prec_elem = 0x1c;
    result_35.m_backend.exp = 0;
    result_35.m_backend.neg = false;
    pnVar37 = &aggr_const;
    pcVar36 = &result_35.m_backend;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    }
    result_35.m_backend.exp = aggr_const.m_backend.exp;
    result_35.m_backend.neg = aggr_const.m_backend.neg;
    result_35.m_backend.fpclass = aggr_const.m_backend.fpclass;
    result_35.m_backend.prec_elem = aggr_const.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_35.m_backend,&obj_j.m_backend);
    (*(this->
      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      )._vptr_SPxSimplifier[0x11])(this,&result_35.m_backend);
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&ptr,lp,i_01);
    uVar31 = local_1cf0;
    result_30.m_backend.fpclass = cpp_dec_float_finite;
    result_30.m_backend.prec_elem = 0x1c;
    result_30.m_backend.data._M_elems[4] = 0;
    result_30.m_backend.data._M_elems[5] = 0;
    result_30.m_backend.data._M_elems[6] = 0;
    result_30.m_backend.data._M_elems[7] = 0;
    result_30.m_backend.data._M_elems[8] = 0;
    result_30.m_backend.data._M_elems[9] = 0;
    result_30.m_backend.data._M_elems[10] = 0;
    result_30.m_backend.data._M_elems[0xb] = 0;
    result_30.m_backend.data._M_elems[0xc] = 0;
    result_30.m_backend.data._M_elems[0xd] = 0;
    result_30.m_backend.data._M_elems[0xe] = 0;
    result_30.m_backend.data._M_elems[0xf] = 0;
    result_30.m_backend.data._M_elems[0x10] = 0;
    result_30.m_backend.data._M_elems[0x11] = 0;
    result_30.m_backend.data._M_elems[0x12] = 0;
    result_30.m_backend.data._M_elems[0x13] = 0;
    result_30.m_backend.data._M_elems[0x14] = 0;
    result_30.m_backend.data._M_elems[0x15] = 0;
    result_30.m_backend.data._M_elems[0x16] = 0;
    result_30.m_backend.data._M_elems[0x17] = 0;
    result_30.m_backend.data._M_elems[0x18] = 0;
    result_30.m_backend.data._M_elems[0x19] = 0;
    result_30.m_backend.data._M_elems._104_5_ = 0;
    result_30.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_30.m_backend.exp = 0;
    result_30.m_backend.neg = false;
    result_30.m_backend.data._M_elems._4_12_ = SUB1612((undefined1  [16])0x0,4);
    result_30.m_backend.data._M_elems[0] = (fpclass_type)local_1ce8;
    puVar35 = local_12fc;
    puVar40 = result_30.m_backend.data._M_elems + 1;
    for (lVar27 = 0x1b; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar40 = *puVar35;
      puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
      puVar40 = puVar40 + (ulong)bVar46 * -2 + 1;
    }
    result_30.m_backend.exp = iVar14;
    local_1cf0._0_4_ = (fpclass_type)uVar49;
    local_1cf0._4_4_ = SUB84(uVar49,4);
    result_30.m_backend.fpclass = (fpclass_type)local_1cf0;
    result_30.m_backend.prec_elem = local_1cf0._4_4_;
    local_1cf0 = uVar31;
    result_30.m_backend.neg = (bool)bVar25;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_30.m_backend,&obj_j.m_backend);
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 0x1c;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&ptr;
    pcVar36 = &result_2.m_backend;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
      pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    }
    result_2.m_backend.exp = iStack_1cf8;
    result_2.m_backend.neg = abStack_1cf4[0];
    result_2.m_backend.fpclass = (fpclass_type)local_1cf0;
    result_2.m_backend.prec_elem = local_1cf0._4_4_;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
              (&result_2.m_backend,&result_30.m_backend);
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(lp,(ulong)i_01,&result_2.m_backend,0);
  }
  uVar15 = local_1588._120_8_;
  bVar19 = local_1588.neg;
  iVar21 = local_1588.exp;
  pcVar36 = &local_1588;
  puVar35 = local_4f0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  local_cc0.fpclass = cpp_dec_float_finite;
  local_cc0.prec_elem = 0x1c;
  local_cc0.exp = 0;
  local_cc0.neg = false;
  pcVar36 = &local_1a88;
  pcVar41 = &local_cc0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  local_cc0.exp = local_1a88.exp;
  local_cc0.neg = local_1a88.neg;
  local_cc0.fpclass = local_1a88.fpclass;
  local_cc0.prec_elem = local_1a88.prec_elem;
  local_1ce8._0_4_ = local_1588.fpclass;
  local_1ce8._4_4_ = local_1588.prec_elem;
  uStack_1ce0 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_cc0,&local_1688);
  puVar35 = local_4f0;
  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&ptr;
  for (lVar27 = 0x1c; uVar16 = local_1588._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  iStack_1cf8 = iVar21;
  abStack_1cf4[0] = bVar19;
  local_1588.fpclass = (fpclass_type)uVar15;
  local_1588.prec_elem = SUB84(uVar15,4);
  local_1cf0._0_4_ = local_1588.fpclass;
  local_1cf0._4_4_ = local_1588.prec_elem;
  if ((bVar19 == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || (fpclass_type)local_1ce8 != 0)) {
    abStack_1cf4[0] = false;
  }
  pcVar36 = &local_cc0;
  pnVar37 = &result_2;
  local_1588._120_8_ = uVar16;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  result_2.m_backend.exp = local_cc0.exp;
  result_2.m_backend.neg = local_cc0.neg;
  result_2.m_backend.fpclass = local_cc0.fpclass;
  result_2.m_backend.prec_elem = local_cc0.prec_elem;
  if ((local_cc0.neg == true) &&
     (result_2.m_backend.data._M_elems[0] != 0 || local_cc0.fpclass != cpp_dec_float_finite)) {
    result_2.m_backend.neg = false;
  }
  if (local_cc0.fpclass == cpp_dec_float_NaN || (fpclass_type)local_1ce8 == 2) {
    bVar19 = false;
  }
  else {
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_2.m_backend);
    bVar19 = 0 < iVar21;
  }
  pnVar37 = &result_2;
  if (bVar19) {
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&ptr;
  }
  pnVar42 = &result_30;
  for (lVar27 = 0x1c; uVar15 = local_1588._120_8_, bVar20 = local_1588.neg, iVar21 = local_1588.exp,
      lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  piVar28 = &result_2.m_backend.exp;
  piVar29 = piVar28;
  if (bVar19) {
    piVar29 = &iStack_1cf8;
  }
  result_30.m_backend.exp = *piVar29;
  pbVar45 = &result_2.m_backend.neg;
  pbVar30 = pbVar45;
  if (bVar19) {
    pbVar30 = abStack_1cf4;
  }
  result_30.m_backend.neg = *pbVar30;
  uVar49 = CONCAT44((int)((uint)bVar19 << 0x1f) >> 0x1f,(int)((uint)bVar19 << 0x1f) >> 0x1f);
  uVar49 = ~uVar49 & result_2.m_backend._120_8_ | local_1cf0 & uVar49;
  result_30.m_backend.fpclass = (int)uVar49;
  result_30.m_backend.prec_elem = (int)(uVar49 >> 0x20);
  pcVar36 = &local_1588;
  puVar35 = local_f90;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  local_d40.fpclass = cpp_dec_float_finite;
  local_d40.prec_elem = 0x1c;
  local_d40.exp = 0;
  local_d40.neg = false;
  pcVar36 = &local_1a88;
  pcVar41 = &local_d40;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  local_d40.exp = local_1a88.exp;
  local_d40.neg = local_1a88.neg;
  local_d40.fpclass = local_1a88.fpclass;
  local_d40.prec_elem = local_1a88.prec_elem;
  local_1ce8._0_4_ = local_1588.fpclass;
  local_1ce8._4_4_ = local_1588.prec_elem;
  uStack_1ce0 = 0;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&local_d40,&local_1608);
  puVar35 = local_f90;
  pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&ptr;
  for (lVar27 = 0x1c; uVar16 = local_1588._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  iStack_1cf8 = iVar21;
  abStack_1cf4[0] = bVar20;
  local_1588.fpclass = (fpclass_type)uVar15;
  local_1588.prec_elem = SUB84(uVar15,4);
  local_1cf0._0_4_ = local_1588.fpclass;
  local_1cf0._4_4_ = local_1588.prec_elem;
  if ((bVar20 == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || (fpclass_type)local_1ce8 != 0)) {
    abStack_1cf4[0] = false;
  }
  pcVar36 = &local_d40;
  pnVar37 = &result_2;
  local_1588._120_8_ = uVar16;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  result_2.m_backend.exp = local_d40.exp;
  result_2.m_backend.neg = local_d40.neg;
  result_2.m_backend.fpclass = local_d40.fpclass;
  result_2.m_backend.prec_elem = local_d40.prec_elem;
  if ((local_d40.neg == true) &&
     (result_2.m_backend.data._M_elems[0] != 0 || local_d40.fpclass != cpp_dec_float_finite)) {
    result_2.m_backend.neg = false;
  }
  if (local_d40.fpclass == cpp_dec_float_NaN || (fpclass_type)local_1ce8 == 2) {
    bVar19 = false;
  }
  else {
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_2.m_backend);
    bVar19 = 0 < iVar21;
  }
  pnVar37 = &result_2;
  if (bVar19) {
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&ptr;
  }
  pnVar42 = &result_29;
  lVar27 = 0x1c;
  if (bVar19) {
    piVar28 = &iStack_1cf8;
  }
  for (; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  if (bVar19) {
    pbVar45 = abStack_1cf4;
  }
  result_29.m_backend.exp = *piVar28;
  result_29.m_backend.neg = *pbVar45;
  uVar49 = CONCAT44((int)((uint)bVar19 << 0x1f) >> 0x1f,(int)((uint)bVar19 << 0x1f) >> 0x1f);
  result_29.m_backend._120_8_ = ~uVar49 & result_2.m_backend._120_8_ | local_1cf0 & uVar49;
  if (result_30.m_backend.fpclass != cpp_dec_float_NaN) {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,1.0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_30.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar21 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_30,1.0);
    }
  }
  if (result_29.m_backend.fpclass != cpp_dec_float_NaN) {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,1.0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_29.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar21 < 0) {
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&result_29,1.0);
    }
  }
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1588,&result_30.m_backend);
  result_42.m_backend.fpclass = cpp_dec_float_finite;
  result_42.m_backend.prec_elem = 0x1c;
  result_42.m_backend.exp = 0;
  result_42.m_backend.neg = false;
  pcVar36 = &local_1a88;
  pcVar41 = &result_42.m_backend;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  result_42.m_backend.exp = local_1a88.exp;
  result_42.m_backend.neg = local_1a88.neg;
  result_42.m_backend.fpclass = local_1a88.fpclass;
  result_42.m_backend.prec_elem = local_1a88.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_42.m_backend,&local_1688);
  result_43.m_backend.fpclass = cpp_dec_float_finite;
  result_43.m_backend.prec_elem = 0x1c;
  result_43.m_backend.data._M_elems[0] = 0;
  result_43.m_backend.data._M_elems[1] = 0;
  result_43.m_backend.data._M_elems[2] = 0;
  result_43.m_backend.data._M_elems[3] = 0;
  result_43.m_backend.data._M_elems[4] = 0;
  result_43.m_backend.data._M_elems[5] = 0;
  result_43.m_backend.data._M_elems[6] = 0;
  result_43.m_backend.data._M_elems[7] = 0;
  result_43.m_backend.data._M_elems[8] = 0;
  result_43.m_backend.data._M_elems[9] = 0;
  result_43.m_backend.data._M_elems[10] = 0;
  result_43.m_backend.data._M_elems[0xb] = 0;
  result_43.m_backend.data._M_elems[0xc] = 0;
  result_43.m_backend.data._M_elems[0xd] = 0;
  result_43.m_backend.data._M_elems[0xe] = 0;
  result_43.m_backend.data._M_elems[0xf] = 0;
  result_43.m_backend.data._M_elems[0x10] = 0;
  result_43.m_backend.data._M_elems[0x11] = 0;
  result_43.m_backend.data._M_elems[0x12] = 0;
  result_43.m_backend.data._M_elems[0x13] = 0;
  result_43.m_backend.data._M_elems[0x14] = 0;
  result_43.m_backend.data._M_elems[0x15] = 0;
  result_43.m_backend.data._M_elems[0x16] = 0;
  result_43.m_backend.data._M_elems[0x17] = 0;
  result_43.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  result_43.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_43.m_backend.exp = 0;
  result_43.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_43.m_backend,&result_42.m_backend,&result_30.m_backend);
  result_2.m_backend.fpclass = cpp_dec_float_finite;
  result_2.m_backend.prec_elem = 0x1c;
  result_2.m_backend.exp = 0;
  result_2.m_backend.neg = false;
  pcVar36 = (cpp_dec_float<200U,_int,_void> *)&ptr;
  pcVar41 = &result_2.m_backend;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  result_2.m_backend.exp = iStack_1cf8;
  result_2.m_backend.neg = abStack_1cf4[0];
  result_2.m_backend.fpclass = (fpclass_type)local_1cf0;
  result_2.m_backend.prec_elem = local_1cf0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&result_2.m_backend,&result_43.m_backend);
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d58 = (undefined1  [16])0x0;
  local_1d48 = (undefined1  [16])0x0;
  local_1d38 = (undefined1  [16])0x0;
  local_1d28 = (undefined1  [16])0x0;
  local_1d18 = (undefined1  [16])0x0;
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1588,&result_29.m_backend);
  result_46.m_backend.fpclass = cpp_dec_float_finite;
  result_46.m_backend.prec_elem = 0x1c;
  result_46.m_backend.exp = 0;
  result_46.m_backend.neg = false;
  pcVar36 = &local_1a88;
  pcVar41 = &result_46.m_backend;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  result_46.m_backend.exp = local_1a88.exp;
  result_46.m_backend.neg = local_1a88.neg;
  result_46.m_backend.fpclass = local_1a88.fpclass;
  result_46.m_backend.prec_elem = local_1a88.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_46.m_backend,&local_1608);
  result_42.m_backend.fpclass = cpp_dec_float_finite;
  result_42.m_backend.prec_elem = 0x1c;
  result_42.m_backend.data._M_elems[0] = 0;
  result_42.m_backend.data._M_elems[1] = 0;
  result_42.m_backend.data._M_elems[2] = 0;
  result_42.m_backend.data._M_elems[3] = 0;
  result_42.m_backend.data._M_elems[4] = 0;
  result_42.m_backend.data._M_elems[5] = 0;
  result_42.m_backend.data._M_elems[6] = 0;
  result_42.m_backend.data._M_elems[7] = 0;
  result_42.m_backend.data._M_elems[8] = 0;
  result_42.m_backend.data._M_elems[9] = 0;
  result_42.m_backend.data._M_elems[10] = 0;
  result_42.m_backend.data._M_elems[0xb] = 0;
  result_42.m_backend.data._M_elems[0xc] = 0;
  result_42.m_backend.data._M_elems[0xd] = 0;
  result_42.m_backend.data._M_elems[0xe] = 0;
  result_42.m_backend.data._M_elems[0xf] = 0;
  result_42.m_backend.data._M_elems[0x10] = 0;
  result_42.m_backend.data._M_elems[0x11] = 0;
  result_42.m_backend.data._M_elems[0x12] = 0;
  result_42.m_backend.data._M_elems[0x13] = 0;
  result_42.m_backend.data._M_elems[0x14] = 0;
  result_42.m_backend.data._M_elems[0x15] = 0;
  result_42.m_backend.data._M_elems[0x16] = 0;
  result_42.m_backend.data._M_elems[0x17] = 0;
  result_42.m_backend.data._M_elems[0x18] = 0;
  result_42.m_backend.data._M_elems[0x19] = 0;
  result_42.m_backend.data._M_elems._104_5_ = 0;
  result_42.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_42.m_backend.exp = 0;
  result_42.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_42.m_backend,&result_46.m_backend,&result_29.m_backend);
  result_43.m_backend.fpclass = cpp_dec_float_finite;
  result_43.m_backend.prec_elem = 0x1c;
  result_43.m_backend.exp = 0;
  result_43.m_backend.neg = false;
  psVar34 = &ptr;
  pcVar36 = &result_43.m_backend;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] =
         *(uint *)&(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
  }
  result_43.m_backend.exp = iStack_1cf8;
  result_43.m_backend.neg = abStack_1cf4[0];
  result_43.m_backend.fpclass = (fpclass_type)local_1cf0;
  result_43.m_backend.prec_elem = local_1cf0._4_4_;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            (&result_43.m_backend,&result_42.m_backend);
  uVar15 = result_2.m_backend._120_8_;
  bVar19 = result_2.m_backend.neg;
  iVar21 = result_2.m_backend.exp;
  pcVar36 = &result_2.m_backend;
  puVar35 = local_560;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  local_1ce8._0_4_ = result_2.m_backend.fpclass;
  local_1ce8._4_4_ = result_2.m_backend.prec_elem;
  uStack_1ce0 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1190,this);
  puVar35 = local_560;
  psVar34 = &ptr;
  for (lVar27 = 0x1c; uVar16 = result_2.m_backend._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)&(psVar34->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
  }
  iStack_1cf8 = iVar21;
  abStack_1cf4[0] = bVar19;
  result_2.m_backend.fpclass = (fpclass_type)uVar15;
  result_2.m_backend.prec_elem = SUB84(uVar15,4);
  local_1cf0._0_4_ = result_2.m_backend.fpclass;
  local_1cf0._4_4_ = result_2.m_backend.prec_elem;
  if ((bVar19 == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || (fpclass_type)local_1ce8 != cpp_dec_float_finite)) {
    abStack_1cf4[0] = false;
  }
  result_2.m_backend._120_8_ = uVar16;
  if ((((fpclass_type)local_1ce8 != cpp_dec_float_NaN) && (local_1190.fpclass != cpp_dec_float_NaN))
     && (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1190), iVar21 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_2,0.0);
  }
  uVar15 = result_43.m_backend._120_8_;
  bVar19 = result_43.m_backend.neg;
  iVar21 = result_43.m_backend.exp;
  pnVar37 = &result_43;
  puVar35 = local_5d0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar35 = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
  }
  local_1ce8._0_4_ = result_43.m_backend.fpclass;
  local_1ce8._4_4_ = result_43.m_backend.prec_elem;
  uStack_1ce0 = 0;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1210,this);
  puVar35 = local_5d0;
  psVar34 = &ptr;
  for (lVar27 = 0x1c; uVar16 = result_43.m_backend._120_8_, lVar27 != 0; lVar27 = lVar27 + -1) {
    *(uint *)&(psVar34->
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
  }
  iStack_1cf8 = iVar21;
  abStack_1cf4[0] = bVar19;
  result_43.m_backend.fpclass = (fpclass_type)uVar15;
  result_43.m_backend.prec_elem = SUB84(uVar15,4);
  local_1cf0._0_4_ = result_43.m_backend.fpclass;
  local_1cf0._4_4_ = result_43.m_backend.prec_elem;
  if ((bVar19 == true) &&
     ((int)ptr.
           super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr != 0 || (fpclass_type)local_1ce8 != cpp_dec_float_finite)) {
    abStack_1cf4[0] = false;
  }
  result_43.m_backend._120_8_ = uVar16;
  if ((((fpclass_type)local_1ce8 != cpp_dec_float_NaN) && (local_1210.fpclass != cpp_dec_float_NaN))
     && (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1210), iVar21 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_43,0.0);
  }
  result_42.m_backend.fpclass = cpp_dec_float_finite;
  result_42.m_backend.prec_elem = 0x1c;
  result_42.m_backend.exp = 0;
  result_42.m_backend.neg = false;
  pcVar36 = &local_1b08;
  pcVar41 = &result_42.m_backend;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  result_42.m_backend.exp = local_1b08.exp;
  result_42.m_backend.neg = local_1b08.neg;
  result_42.m_backend.fpclass = local_1b08.fpclass;
  result_42.m_backend.prec_elem = local_1b08.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
            (&result_42.m_backend,&local_1a88);
  if (result_42.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_005786fd:
    result_42.m_backend.fpclass = cpp_dec_float_finite;
    result_42.m_backend.prec_elem = 0x1c;
    result_42.m_backend.exp = 0;
    result_42.m_backend.neg = false;
    pcVar36 = &local_1b08;
    pcVar41 = &result_42.m_backend;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
      pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
      pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
    }
    result_42.m_backend.exp = local_1b08.exp;
    result_42.m_backend.neg = local_1b08.neg;
    result_42.m_backend.fpclass = local_1b08.fpclass;
    result_42.m_backend.prec_elem = local_1b08.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
              (&result_42.m_backend,&local_1a88);
    if (result_42.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_00579158:
      puVar24 = (undefined8 *)__cxa_allocate_exception(0x28);
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_1d58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&ptr,"XMAISM12 This should never happen.","");
      *puVar24 = &PTR__SPxException_006a9ee8;
      puVar24[1] = puVar24 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar24 + 1),
                 ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,(long)&(ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                         (long)ptr.
                               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
      *puVar24 = &PTR__SPxException_006a9ec0;
      __cxa_throw(puVar24,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    }
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_42.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (-1 < iVar21) goto LAB_00579158;
    ::soplex::infinity::__tls_init();
    result_42.m_backend.fpclass = cpp_dec_float_finite;
    result_42.m_backend.prec_elem = 0x1c;
    result_42.m_backend.data._M_elems[0] = 0;
    result_42.m_backend.data._M_elems[1] = 0;
    result_42.m_backend.data._M_elems[2] = 0;
    result_42.m_backend.data._M_elems[3] = 0;
    result_42.m_backend.data._M_elems[4] = 0;
    result_42.m_backend.data._M_elems[5] = 0;
    result_42.m_backend.data._M_elems[6] = 0;
    result_42.m_backend.data._M_elems[7] = 0;
    result_42.m_backend.data._M_elems[8] = 0;
    result_42.m_backend.data._M_elems[9] = 0;
    result_42.m_backend.data._M_elems[10] = 0;
    result_42.m_backend.data._M_elems[0xb] = 0;
    result_42.m_backend.data._M_elems[0xc] = 0;
    result_42.m_backend.data._M_elems[0xd] = 0;
    result_42.m_backend.data._M_elems[0xe] = 0;
    result_42.m_backend.data._M_elems[0xf] = 0;
    result_42.m_backend.data._M_elems[0x10] = 0;
    result_42.m_backend.data._M_elems[0x11] = 0;
    result_42.m_backend.data._M_elems[0x12] = 0;
    result_42.m_backend.data._M_elems[0x13] = 0;
    result_42.m_backend.data._M_elems[0x14] = 0;
    result_42.m_backend.data._M_elems[0x15] = 0;
    result_42.m_backend.data._M_elems[0x16] = 0;
    result_42.m_backend.data._M_elems[0x17] = 0;
    result_42.m_backend.data._M_elems[0x18] = 0;
    result_42.m_backend.data._M_elems[0x19] = 0;
    result_42.m_backend.data._M_elems._104_5_ = 0;
    result_42.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_42.m_backend.exp = 0;
    result_42.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_42,a);
    if (((local_1608.fpclass == cpp_dec_float_NaN) ||
        (result_42.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1608,&result_42.m_backend), 0 < iVar21)) {
      result_46.m_backend.fpclass = cpp_dec_float_finite;
      result_46.m_backend.prec_elem = 0x1c;
      result_46.m_backend.exp = 0;
      result_46.m_backend.neg = false;
      pnVar37 = &result_43;
      pcVar36 = &result_46.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
      }
      result_46.m_backend.exp = result_43.m_backend.exp;
      result_46.m_backend.neg = result_43.m_backend.neg;
      result_46.m_backend.fpclass = result_43.m_backend.fpclass;
      result_46.m_backend.prec_elem = result_43.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_46.m_backend,&result_29.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_46.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,a);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1808;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = abStack_1cf4[0];
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_42.m_backend.fpclass = cpp_dec_float_finite;
    result_42.m_backend.prec_elem = 0x1c;
    result_42.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems[0x18] = 0;
    result_42.m_backend.data._M_elems[0x19] = 0;
    result_42.m_backend.data._M_elems._104_5_ = 0;
    result_42.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_42.m_backend.exp = 0;
    result_42.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_42,dVar47);
    if (((local_1688.fpclass == cpp_dec_float_NaN) ||
        (result_42.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1688,&result_42.m_backend), iVar21 < 0)) {
      result_46.m_backend.fpclass = cpp_dec_float_finite;
      result_46.m_backend.prec_elem = 0x1c;
      result_46.m_backend.exp = 0;
      result_46.m_backend.neg = false;
      pnVar37 = &result_2;
      pnVar42 = &result_46;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      result_46.m_backend.exp = result_2.m_backend.exp;
      result_46.m_backend.neg = result_2.m_backend.neg;
      result_46.m_backend.fpclass = result_2.m_backend.fpclass;
      result_46.m_backend.prec_elem = result_2.m_backend.prec_elem;
      pcVar36 = &result_30.m_backend;
      goto LAB_00578b4c;
    }
  }
  else {
    local_1cf0._0_4_ = cpp_dec_float_finite;
    local_1cf0._4_4_ = 0x1c;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1d58 = (undefined1  [16])0x0;
    local_1d48 = (undefined1  [16])0x0;
    local_1d38 = (undefined1  [16])0x0;
    local_1d28 = (undefined1  [16])0x0;
    local_1d18 = (undefined1  [16])0x0;
    local_1d08[0] = 0;
    local_1d08[1] = 0;
    stack0xffffffffffffe300 = 0;
    uStack_1cfb = 0;
    iStack_1cf8 = 0;
    abStack_1cf4[0] = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&ptr,0.0);
    iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                       (&result_42.m_backend,(cpp_dec_float<200U,_int,_void> *)&ptr);
    if (iVar21 < 1) goto LAB_005786fd;
    ::soplex::infinity::__tls_init();
    result_42.m_backend.fpclass = cpp_dec_float_finite;
    result_42.m_backend.prec_elem = 0x1c;
    result_42.m_backend.data._M_elems[0] = 0;
    result_42.m_backend.data._M_elems[1] = 0;
    result_42.m_backend.data._M_elems[2] = 0;
    result_42.m_backend.data._M_elems[3] = 0;
    result_42.m_backend.data._M_elems[4] = 0;
    result_42.m_backend.data._M_elems[5] = 0;
    result_42.m_backend.data._M_elems[6] = 0;
    result_42.m_backend.data._M_elems[7] = 0;
    result_42.m_backend.data._M_elems[8] = 0;
    result_42.m_backend.data._M_elems[9] = 0;
    result_42.m_backend.data._M_elems[10] = 0;
    result_42.m_backend.data._M_elems[0xb] = 0;
    result_42.m_backend.data._M_elems[0xc] = 0;
    result_42.m_backend.data._M_elems[0xd] = 0;
    result_42.m_backend.data._M_elems[0xe] = 0;
    result_42.m_backend.data._M_elems[0xf] = 0;
    result_42.m_backend.data._M_elems[0x10] = 0;
    result_42.m_backend.data._M_elems[0x11] = 0;
    result_42.m_backend.data._M_elems[0x12] = 0;
    result_42.m_backend.data._M_elems[0x13] = 0;
    result_42.m_backend.data._M_elems[0x14] = 0;
    result_42.m_backend.data._M_elems[0x15] = 0;
    result_42.m_backend.data._M_elems[0x16] = 0;
    result_42.m_backend.data._M_elems[0x17] = 0;
    result_42.m_backend.data._M_elems[0x18] = 0;
    result_42.m_backend.data._M_elems[0x19] = 0;
    result_42.m_backend.data._M_elems._104_5_ = 0;
    result_42.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_42.m_backend.exp = 0;
    result_42.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_42,dVar47);
    if (((local_1688.fpclass == cpp_dec_float_NaN) ||
        (result_42.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1688,&result_42.m_backend), iVar21 < 0)) {
      result_46.m_backend.fpclass = cpp_dec_float_finite;
      result_46.m_backend.prec_elem = 0x1c;
      result_46.m_backend.exp = 0;
      result_46.m_backend.neg = false;
      pnVar37 = &result_2;
      pcVar36 = &result_46.m_backend;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pcVar36->data)._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
      }
      result_46.m_backend.exp = result_2.m_backend.exp;
      result_46.m_backend.neg = result_2.m_backend.neg;
      result_46.m_backend.fpclass = result_2.m_backend.fpclass;
      result_46.m_backend.prec_elem = result_2.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_46.m_backend,&result_30.m_backend);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_46.m_backend,&local_1b08);
    }
    else {
      ::soplex::infinity::__tls_init();
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                ((cpp_dec_float<200u,int,void> *)&ptr,a);
    }
    psVar34 = &ptr;
    puVar39 = (undefined4 *)local_1808;
    for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
      *puVar39 = *(undefined4 *)
                  &(psVar34->
                   super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
      psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                 *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
      puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
    }
    iStack_1798 = iStack_1cf8;
    bStack_1794 = abStack_1cf4[0];
    local_1790._0_4_ = (fpclass_type)local_1cf0;
    local_1790._4_4_ = local_1cf0._4_4_;
    ::soplex::infinity::__tls_init();
    result_42.m_backend.fpclass = cpp_dec_float_finite;
    result_42.m_backend.prec_elem = 0x1c;
    result_42.m_backend.data._M_elems._0_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._16_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._32_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._48_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._64_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems._80_16_ = ZEXT816(0);
    result_42.m_backend.data._M_elems[0x18] = 0;
    result_42.m_backend.data._M_elems[0x19] = 0;
    result_42.m_backend.data._M_elems._104_5_ = 0;
    result_42.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_42.m_backend.exp = 0;
    result_42.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&result_42,a);
    if (((local_1608.fpclass == cpp_dec_float_NaN) ||
        (result_42.m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           (&local_1608,&result_42.m_backend), 0 < iVar21)) {
      result_46.m_backend.fpclass = cpp_dec_float_finite;
      result_46.m_backend.prec_elem = 0x1c;
      result_46.m_backend.exp = 0;
      result_46.m_backend.neg = false;
      pnVar37 = &result_43;
      pnVar42 = &result_46;
      for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
        (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
        pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
        pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
      }
      result_46.m_backend.exp = result_43.m_backend.exp;
      result_46.m_backend.neg = result_43.m_backend.neg;
      result_46.m_backend.fpclass = result_43.m_backend.fpclass;
      result_46.m_backend.prec_elem = result_43.m_backend.prec_elem;
      pcVar36 = &result_29.m_backend;
LAB_00578b4c:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                (&result_46.m_backend,pcVar36);
      local_1cf0._0_4_ = cpp_dec_float_finite;
      local_1cf0._4_4_ = 0x1c;
      ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
           = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              )ZEXT816(0);
      local_1d58 = ZEXT816(0);
      local_1d48 = ZEXT816(0);
      local_1d38 = ZEXT816(0);
      local_1d28 = ZEXT816(0);
      local_1d18 = ZEXT816(0);
      local_1d08[0] = 0;
      local_1d08[1] = 0;
      stack0xffffffffffffe300 = 0;
      uStack_1cfb = 0;
      iStack_1cf8 = 0;
      abStack_1cf4[0] = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>,boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,&result_46.m_backend,&local_1b08);
      goto LAB_00578c2d;
    }
  }
  ::soplex::infinity::__tls_init();
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
          )ZEXT816(0);
  local_1d58 = ZEXT816(0);
  local_1d48 = ZEXT816(0);
  local_1d38 = ZEXT816(0);
  local_1d28 = ZEXT816(0);
  local_1d18 = ZEXT816(0);
  local_1d08[0] = 0;
  local_1d08[1] = 0;
  stack0xffffffffffffe300 = 0;
  uStack_1cfb = 0;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&ptr,dVar47);
LAB_00578c2d:
  psVar34 = &ptr;
  puVar39 = (undefined4 *)local_1888;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar39 = *(undefined4 *)
                &(psVar34->
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
    psVar34 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
               *)((long)psVar34 + (ulong)bVar46 * -8 + 4);
    puVar39 = puVar39 + (ulong)bVar46 * -2 + 1;
  }
  iStack_1818 = iStack_1cf8;
  bStack_1814 = abStack_1cf4[0];
  local_1810._0_4_ = (fpclass_type)local_1cf0;
  local_1810._4_4_ = local_1cf0._4_4_;
  pcVar36 = &local_1488;
  pnVar37 = &result_42;
  for (lVar27 = 0x1c; bVar18 = local_1488.neg, iVar14 = local_1488.exp, uVar16 = local_1508._120_8_,
      bVar20 = local_1508.neg, iVar5 = local_1508.exp, uVar15 = local_1790, bVar19 = bStack_1794,
      iVar21 = iStack_1798, lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  iVar7 = local_1488.prec_elem;
  pcVar36 = &local_1508;
  pnVar37 = &result_46;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  puVar35 = (uint *)local_1808;
  puVar40 = local_640;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    *puVar40 = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    puVar40 = puVar40 + (ulong)bVar46 * -2 + 1;
  }
  pcVar36 = &local_1488;
  pcVar41 = &local_130;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar41->data)._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pcVar41 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar41 + (ulong)bVar46 * -8 + 4);
  }
  local_130.exp = local_1488.exp;
  local_130.neg = local_1488.neg;
  local_1ce8 = CONCAT44(local_1ce8._4_4_,local_1488.fpclass);
  local_130.fpclass = local_1488.fpclass;
  local_130.prec_elem = local_1488.prec_elem;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_1290,this);
  local_1cf0._0_4_ = cpp_dec_float_finite;
  local_1cf0._4_4_ = 0x1c;
  iStack_1cf8 = 0;
  abStack_1cf4[0] = false;
  puVar35 = local_640;
  pcVar36 = (cpp_dec_float<200U,_int,_void> *)&ptr;
  for (lVar27 = 0x1c; uVar17 = local_1790, lVar27 != 0; lVar27 = lVar27 + -1) {
    (pcVar36->data)._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + (ulong)bVar46 * -8 + 4);
  }
  iStack_1cf8 = iVar21;
  abStack_1cf4[0] = bVar19;
  local_1790._0_4_ = (fpclass_type)uVar15;
  local_1790._4_4_ = SUB84(uVar15,4);
  local_1cf0._0_4_ = (fpclass_type)local_1790;
  local_1cf0._4_4_ = local_1790._4_4_;
  local_1790 = uVar17;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_130);
  if ((((fpclass_type)local_1cf0 != cpp_dec_float_NaN) && (local_1290.fpclass != cpp_dec_float_NaN))
     && (iVar21 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)&ptr,&local_1290), 0 < iVar21)) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(lp,(ulong)i_01,local_1808,0);
    piVar28 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar28 = *piVar28 + 1;
  }
  puVar35 = (uint *)local_1888;
  pnVar37 = &local_1b0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = *puVar35;
    puVar35 = puVar35 + (ulong)bVar46 * -2 + 1;
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_1b0.m_backend.exp = iStack_1818;
  local_1b0.m_backend.neg = bStack_1814;
  local_1b0.m_backend.fpclass = (fpclass_type)local_1810;
  local_1b0.m_backend.prec_elem = local_1810._4_4_;
  pcVar36 = &local_1508;
  pnVar37 = &local_230;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = local_1508.exp;
  local_230.m_backend.neg = local_1508.neg;
  local_230.m_backend.fpclass = local_1508.fpclass;
  local_230.m_backend.prec_elem = local_1508.prec_elem;
  epsZero(&local_2b0,this);
  bVar19 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                     (&local_1b0,&local_230,&local_2b0);
  if (bVar19) {
    (*(lp->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(lp,(ulong)i_01,local_1888,0);
    piVar28 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_chgBnds;
    *piVar28 = *piVar28 + 1;
  }
  this_00 = (AggregationPS *)operator_new(0x378);
  uVar15 = local_1508._120_8_;
  iVar21 = *i;
  pcVar36 = &local_1588;
  pnVar37 = &local_dc0;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar37->m_backend).data._M_elems[0] = (pcVar36->data)._M_elems[0];
    pcVar36 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar36 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_dc0.m_backend.exp = local_1588.exp;
  local_dc0.m_backend.neg = local_1588.neg;
  local_dc0.m_backend.fpclass = local_1588.fpclass;
  local_dc0.m_backend.prec_elem = local_1588.prec_elem;
  pnVar37 = &result_46;
  pnVar42 = &local_e40;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_e40.m_backend.exp = iVar5;
  local_e40.m_backend.neg = bVar20;
  local_1508.fpclass = (fpclass_type)uVar16;
  local_1508.prec_elem = SUB84(uVar16,4);
  local_e40.m_backend.fpclass = local_1508.fpclass;
  local_e40.m_backend.prec_elem = local_1508.prec_elem;
  pnVar37 = &result_42;
  pnVar42 = &local_330;
  for (lVar27 = 0x1c; lVar27 != 0; lVar27 = lVar27 + -1) {
    (pnVar42->m_backend).data._M_elems[0] = (pnVar37->m_backend).data._M_elems[0];
    pnVar37 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar37 + ((ulong)bVar46 * -2 + 1) * 4);
    pnVar42 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar42 + ((ulong)bVar46 * -2 + 1) * 4);
  }
  local_330.m_backend.exp = iVar14;
  local_330.m_backend.neg = bVar18;
  local_330.m_backend.fpclass = (fpclass_type)local_1ce8;
  local_330.m_backend.prec_elem = iVar7;
  local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->
       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_1508._120_8_ = uVar15;
  AggregationPS::AggregationPS(this_00,lp,iVar21,i_00,&local_dc0,&local_e40,&local_330,&local_1ba0);
  ptr.
  super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::AggregationPS*>
            (&ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_00);
  if (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1ba0.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::push_back(&(this->m_hist).data,&ptr);
  piVar28 = (this->m_rIdx).data;
  piVar28[*i] = piVar28[(long)(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0xf])(lp);
  piVar28 = (this->m_cIdx).data;
  piVar28[local_1b90] =
       piVar28[(long)(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum + -1];
  (*(lp->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x15])(lp,lVar26);
  uVar2 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remRows;
  uVar3 = (this->
          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).m_remCols;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remRows = uVar2 + 1;
  (this->
  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).m_remCols = uVar3 + 1;
  piVar28 = &(this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_remNzos;
  *piVar28 = *piVar28 + 2;
  piVar28 = (this->m_stat).data + 0xf;
  *piVar28 = *piVar28 + 1;
  if (ptr.
      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (ptr.
               super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::aggregateVars(SPxLPBase<R>& lp,
      const SVectorBase<R>& row, int& i)
{
   assert(row.size() == 2);
   assert(EQrel(lp.lhs(i), lp.rhs(i), feastol()));

   R rhs = lp.rhs(i);
   assert(rhs < R(infinity) && rhs > R(-infinity));

   int j = row.index(0);
   int k = row.index(1);
   R aij = row.value(0);
   R aik = row.value(1);
   R lower_j = lp.lower(j);
   R upper_j = lp.upper(j);
   R lower_k = lp.lower(k);
   R upper_k = lp.upper(k);

   // fixed variables should be removed by simplifyCols()
   if(EQrel(lower_j, upper_j, feastol()) || EQrel(lower_k, upper_k, feastol()))
      return this->OKAY;

   assert(isNotZero(aij, this->epsZero()) && isNotZero(aik, this->epsZero()));

   SPxOut::debug(this, "IMAISM23 row {}: doubleton equation -> {} x_{} + {} x_{} = {}", i, aij, j, aik,
                 k, rhs);

   // determine which variable can be aggregated without requiring bound tightening of the other variable
   R new_lo_j;
   R new_up_j;
   R new_lo_k;
   R new_up_k;

   if(aij * aik < 0.0)
   {
      // orientation persists
      new_lo_j = (upper_k >=  R(infinity)) ? R(-infinity) : (rhs - aik * upper_k) / aij;
      new_up_j = (lower_k <= R(-infinity)) ?  R(infinity) : (rhs - aik * lower_k) / aij;
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : (rhs - aij * upper_j) / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : (rhs - aij * lower_j) / aik;
   }
   else if(aij * aik > 0.0)
   {
      // orientation is reversed
      new_lo_j = (lower_k <= R(-infinity)) ? R(-infinity) : (rhs - aik * lower_k) / aij;
      new_up_j = (upper_k >=  R(infinity)) ?  R(infinity) : (rhs - aik * upper_k) / aij;
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : (rhs - aij * lower_j) / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : (rhs - aij * upper_j) / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   bool flip_jk = false;

   if(new_lo_j <= R(-infinity) && new_up_j >= R(infinity))
   {
      // no bound tightening on x_j when x_k is aggregated
      flip_jk = true;
   }
   else if(new_lo_k <= R(-infinity) && new_up_k >= R(infinity))
   {
      // no bound tightening on x_k when x_j is aggregated
      flip_jk = false;
   }
   else if(LE(new_lo_j, lower_j, this->tolerances()->epsilon())
           && GE(new_up_j, upper_j, this->tolerances()->epsilon()))
   {
      if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
            && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
      {
         // both variables' bounds are not affected by aggregation; choose the better aggregation coeff (aik/aij)
         if(spxAbs(aij) > spxAbs(aik))
            flip_jk = false;
         else
            flip_jk = true;
      }
      else
         flip_jk = false;
   }
   else if(LE(new_lo_k, lower_k, this->tolerances()->epsilon())
           && GE(new_up_k, upper_k, this->tolerances()->epsilon()))
   {
      flip_jk = true;
   }
   else
   {
      if(spxAbs(aij) > spxAbs(aik))
         flip_jk = false;
      else
         flip_jk = true;
   }

   if(flip_jk)
   {
      int _j = j;
      R _aij = aij;
      R _lower_j = lower_j;
      R _upper_j = upper_j;
      j = k;
      k = _j;
      aij = aik;
      aik = _aij;
      lower_j = lower_k;
      lower_k = _lower_j;
      upper_j = upper_k;
      upper_k = _upper_j;
   }

   const SVectorBase<R>& col_j = lp.colVector(j);
   const SVectorBase<R>& col_k = lp.colVector(k);

   // aggregation coefficients (x_j = aggr_coef * x_k + aggr_const)
   R aggr_coef = - (aik / aij);
   R aggr_const = rhs / aij;

   SPxOut::debug(this, " removed, replacing x_{} with {} + {} * x_{}\n", j, aggr_const, aggr_coef, k);

   // replace all occurrences of x_j
   for(int r = 0; r < col_j.size(); ++r)
   {
      int row_r = col_j.index(r);
      R arj = col_j.value(r);

      // skip row i
      if(row_r == i)
         continue;

      // adapt sides of row r
      R lhs_r = lp.lhs(row_r);
      R rhs_r = lp.rhs(row_r);

      if(lhs_r > R(-infinity))
      {
         lp.changeLhs(row_r, lhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      if(rhs_r < R(infinity))
      {
         lp.changeRhs(row_r, rhs_r - aggr_const * arj);
         this->m_chgLRhs++;
      }

      R newcoef = aggr_coef * arj;
      int pos_rk = col_k.pos(row_r);

      // check whether x_k is also present in row r and get its coefficient
      if(pos_rk >= 0)
      {
         R ark = col_k.value(pos_rk);
         newcoef += ark;
         this->m_remNzos++;
      }

      // add new column k to row r or adapt the coefficient a_rk
      lp.changeElement(row_r, k, newcoef);
   }

   // adapt objective function
   R obj_j = lp.obj(j);

   if(isNotZero(obj_j, this->epsZero()))
   {
      this->addObjoffset(aggr_const * obj_j);
      R obj_k = lp.obj(k);
      lp.changeObj(k, obj_k + aggr_coef * obj_j);
   }

   // adapt bounds of x_k
   R scale1 = maxAbs(rhs, aij * upper_j);
   R scale2 = maxAbs(rhs, aij * lower_j);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (rhs / scale1) - (aij * upper_j / scale1);
   R z2 = (rhs / scale2) - (aij * lower_j / scale2);

   // just some rounding
   if(isZero(z1, this->epsZero()))
      z1 = 0.0;

   if(isZero(z2, this->epsZero()))
      z2 = 0.0;

   // determine which side has to be used for the bounds comparison below
   if(aik * aij > 0.0)
   {
      new_lo_k = (upper_j >=  R(infinity)) ? R(-infinity) : z1 * scale1 / aik;
      new_up_k = (lower_j <= R(-infinity)) ?  R(infinity) : z2 * scale2 / aik;
   }
   else if(aik * aij < 0.0)
   {
      new_lo_k = (lower_j <= R(-infinity)) ? R(-infinity) : z2 * scale2 / aik;
      new_up_k = (upper_j >=  R(infinity)) ?  R(infinity) : z1 * scale1 / aik;
   }
   else
      throw SPxInternalCodeException("XMAISM12 This should never happen.");

   // change bounds of x_k if the new ones are tighter
   R oldlower_k = lower_k;
   R oldupper_k = upper_k;

   if(GT(new_lo_k, lower_k, this->epsZero()))
   {
      lp.changeLower(k, new_lo_k);
      this->m_chgBnds++;
   }

   if(LT(new_up_k, upper_k, this->epsZero()))
   {
      lp.changeUpper(k, new_up_k);
      this->m_chgBnds++;
   }

   std::shared_ptr<PostStep> ptr(new AggregationPS(lp, i, j, rhs, oldupper_k, oldlower_k,
                                 this->_tolerances));
   m_hist.append(ptr);

   removeRow(lp, i);
   removeCol(lp, j);

   this->m_remRows++;
   this->m_remCols++;
   this->m_remNzos += 2;

   ++m_stat[AGGREGATION];

   return this->OKAY;
}